

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersector1<8>::
     occluded_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  Primitive PVar4;
  uint uVar5;
  Geometry *pGVar6;
  __int_type_conflict _Var7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  bool bVar13;
  undefined8 uVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  byte bVar29;
  uint uVar30;
  ulong uVar31;
  uint uVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  uint uVar37;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  long lVar38;
  ulong uVar39;
  uint uVar40;
  bool bVar41;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar105 [32];
  int iVar107;
  float t1;
  undefined4 uVar108;
  undefined1 auVar109 [16];
  float fVar110;
  vfloat4 a0;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  float fVar119;
  vfloat4 a0_1;
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar127;
  vfloat4 b0;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar143;
  float fVar144;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  vfloat4 b0_1;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  __m128 a;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar211;
  float fVar212;
  vfloat4 a0_2;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar213;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  vfloat4 b0_2;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  vfloat4 a0_3;
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 auVar253 [64];
  undefined1 in_ZMM25 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  int iVar258;
  undefined1 in_ZMM31 [64];
  undefined1 auVar259 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_389;
  int local_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  long local_2f0;
  ulong local_2e8;
  Primitive *local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [8];
  float fStack_210;
  float fStack_20c;
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  uint auStack_188 [4];
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_16c;
  undefined4 local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  uint uStack_d8;
  float afStack_d4 [7];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  ulong auStack_58 [5];
  ulong uVar32;
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar78 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  undefined1 auVar104 [32];
  undefined1 auVar106 [32];
  undefined1 auVar236 [32];
  
  PVar4 = prim[1];
  uVar31 = (ulong)(byte)PVar4;
  lVar38 = uVar31 * 0x25;
  fVar216 = *(float *)(prim + lVar38 + 0x12);
  auVar96._16_16_ =
       vsubps_avx((undefined1  [16])(ray->org).field_0,*(undefined1 (*) [16])(prim + lVar38 + 6));
  fVar119 = fVar216 * (ray->dir).field_0.m128[0];
  fVar127 = fVar216 * auVar96._16_4_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar31 * 4 + 6);
  auVar70 = vpmovsxbd_avx2(auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar31 * 5 + 6);
  auVar69 = vpmovsxbd_avx2(auVar43);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar31 * 6 + 6);
  auVar79 = vpmovsxbd_avx2(auVar56);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar31 * 0xf + 6);
  auVar90 = vpmovsxbd_avx2(auVar57);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  auVar84 = vpmovsxbd_avx2(auVar62);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar91 = vcvtdq2ps_avx(auVar84);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar31 + 6);
  auVar80 = vpmovsxbd_avx2(auVar63);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar31 * 0x1a + 6);
  auVar81 = vpmovsxbd_avx2(auVar64);
  auVar81 = vcvtdq2ps_avx(auVar81);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = *(ulong *)(prim + uVar31 * 0x1b + 6);
  auVar82 = vpmovsxbd_avx2(auVar65);
  auVar82 = vcvtdq2ps_avx(auVar82);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar31 * 0x1c + 6);
  auVar83 = vpmovsxbd_avx2(auVar44);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar93._4_4_ = fVar119;
  auVar93._0_4_ = fVar119;
  auVar93._8_4_ = fVar119;
  auVar93._12_4_ = fVar119;
  auVar93._16_4_ = fVar119;
  auVar93._20_4_ = fVar119;
  auVar93._24_4_ = fVar119;
  auVar93._28_4_ = fVar119;
  auVar249._8_4_ = 1;
  auVar249._0_8_ = 0x100000001;
  auVar249._12_4_ = 1;
  auVar249._16_4_ = 1;
  auVar249._20_4_ = 1;
  auVar249._24_4_ = 1;
  auVar249._28_4_ = 1;
  auVar66 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar250 = ZEXT3264(auVar66);
  auVar68 = ZEXT1632(CONCAT412(fVar216 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar216 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar216 * (ray->dir).field_0.m128[1],fVar119))));
  auVar85 = vpermps_avx2(auVar249,auVar68);
  auVar67 = vpermps_avx512vl(auVar66,auVar68);
  fVar199 = auVar67._0_4_;
  auVar89._0_4_ = fVar199 * auVar79._0_4_;
  fVar211 = auVar67._4_4_;
  auVar89._4_4_ = fVar211 * auVar79._4_4_;
  fVar212 = auVar67._8_4_;
  auVar89._8_4_ = fVar212 * auVar79._8_4_;
  fVar213 = auVar67._12_4_;
  auVar89._12_4_ = fVar213 * auVar79._12_4_;
  fVar214 = auVar67._16_4_;
  auVar89._16_4_ = fVar214 * auVar79._16_4_;
  fVar215 = auVar67._20_4_;
  auVar89._20_4_ = fVar215 * auVar79._20_4_;
  fVar110 = auVar67._24_4_;
  auVar89._24_4_ = fVar110 * auVar79._24_4_;
  auVar89._28_4_ = 0;
  auVar68._4_4_ = auVar80._4_4_ * fVar211;
  auVar68._0_4_ = auVar80._0_4_ * fVar199;
  auVar68._8_4_ = auVar80._8_4_ * fVar212;
  auVar68._12_4_ = auVar80._12_4_ * fVar213;
  auVar68._16_4_ = auVar80._16_4_ * fVar214;
  auVar68._20_4_ = auVar80._20_4_ * fVar215;
  auVar68._24_4_ = auVar80._24_4_ * fVar110;
  auVar68._28_4_ = auVar84._28_4_;
  auVar84._4_4_ = auVar83._4_4_ * fVar211;
  auVar84._0_4_ = auVar83._0_4_ * fVar199;
  auVar84._8_4_ = auVar83._8_4_ * fVar212;
  auVar84._12_4_ = auVar83._12_4_ * fVar213;
  auVar84._16_4_ = auVar83._16_4_ * fVar214;
  auVar84._20_4_ = auVar83._20_4_ * fVar215;
  auVar84._24_4_ = auVar83._24_4_ * fVar110;
  auVar84._28_4_ = auVar67._28_4_;
  auVar42 = vfmadd231ps_fma(auVar89,auVar85,auVar69);
  auVar43 = vfmadd231ps_fma(auVar68,auVar85,auVar91);
  auVar56 = vfmadd231ps_fma(auVar84,auVar82,auVar85);
  auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar93,auVar70);
  auVar43 = vfmadd231ps_fma(ZEXT1632(auVar43),auVar93,auVar90);
  auVar56 = vfmadd231ps_fma(ZEXT1632(auVar56),auVar81,auVar93);
  auVar244._4_4_ = fVar127;
  auVar244._0_4_ = fVar127;
  auVar244._8_4_ = fVar127;
  auVar244._12_4_ = fVar127;
  auVar244._16_4_ = fVar127;
  auVar244._20_4_ = fVar127;
  auVar244._24_4_ = fVar127;
  auVar244._28_4_ = fVar127;
  auVar85 = ZEXT1632(CONCAT412(fVar216 * auVar96._28_4_,
                               CONCAT48(fVar216 * auVar96._24_4_,
                                        CONCAT44(fVar216 * auVar96._20_4_,fVar127))));
  auVar84 = vpermps_avx2(auVar249,auVar85);
  auVar68 = vpermps_avx512vl(auVar66,auVar85);
  fVar216 = auVar68._0_4_;
  fVar199 = auVar68._4_4_;
  auVar85._4_4_ = fVar199 * auVar79._4_4_;
  auVar85._0_4_ = fVar216 * auVar79._0_4_;
  fVar211 = auVar68._8_4_;
  auVar85._8_4_ = fVar211 * auVar79._8_4_;
  fVar212 = auVar68._12_4_;
  auVar85._12_4_ = fVar212 * auVar79._12_4_;
  fVar213 = auVar68._16_4_;
  auVar85._16_4_ = fVar213 * auVar79._16_4_;
  fVar214 = auVar68._20_4_;
  auVar85._20_4_ = fVar214 * auVar79._20_4_;
  fVar215 = auVar68._24_4_;
  auVar85._24_4_ = fVar215 * auVar79._24_4_;
  auVar85._28_4_ = fVar119;
  auVar66._4_4_ = auVar80._4_4_ * fVar199;
  auVar66._0_4_ = auVar80._0_4_ * fVar216;
  auVar66._8_4_ = auVar80._8_4_ * fVar211;
  auVar66._12_4_ = auVar80._12_4_ * fVar212;
  auVar66._16_4_ = auVar80._16_4_ * fVar213;
  auVar66._20_4_ = auVar80._20_4_ * fVar214;
  auVar66._24_4_ = auVar80._24_4_ * fVar215;
  auVar66._28_4_ = auVar79._28_4_;
  auVar80._4_4_ = auVar83._4_4_ * fVar199;
  auVar80._0_4_ = auVar83._0_4_ * fVar216;
  auVar80._8_4_ = auVar83._8_4_ * fVar211;
  auVar80._12_4_ = auVar83._12_4_ * fVar212;
  auVar80._16_4_ = auVar83._16_4_ * fVar213;
  auVar80._20_4_ = auVar83._20_4_ * fVar214;
  auVar80._24_4_ = auVar83._24_4_ * fVar215;
  auVar80._28_4_ = auVar68._28_4_;
  auVar57 = vfmadd231ps_fma(auVar85,auVar84,auVar69);
  auVar62 = vfmadd231ps_fma(auVar66,auVar84,auVar91);
  auVar63 = vfmadd231ps_fma(auVar80,auVar84,auVar82);
  auVar96._16_16_ = vfmadd231ps_fma(ZEXT1632(auVar57),auVar244,auVar70);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar244,auVar90);
  auVar94._8_4_ = 0x7fffffff;
  auVar94._0_8_ = 0x7fffffff7fffffff;
  auVar94._12_4_ = 0x7fffffff;
  auVar94._16_4_ = 0x7fffffff;
  auVar94._20_4_ = 0x7fffffff;
  auVar94._24_4_ = 0x7fffffff;
  auVar94._28_4_ = 0x7fffffff;
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar63),auVar244,auVar81);
  auVar70 = vandps_avx(ZEXT1632(auVar42),auVar94);
  auVar188._8_4_ = 0x219392ef;
  auVar188._0_8_ = 0x219392ef219392ef;
  auVar188._12_4_ = 0x219392ef;
  auVar188._16_4_ = 0x219392ef;
  auVar188._20_4_ = 0x219392ef;
  auVar188._24_4_ = 0x219392ef;
  auVar188._28_4_ = 0x219392ef;
  uVar39 = vcmpps_avx512vl(auVar70,auVar188,1);
  bVar41 = (bool)((byte)uVar39 & 1);
  auVar67._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar42._0_4_;
  bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar67._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar42._4_4_;
  bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar67._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar42._8_4_;
  bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar67._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar42._12_4_;
  auVar67._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * 0x219392ef;
  auVar67._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * 0x219392ef;
  auVar67._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * 0x219392ef;
  auVar67._28_4_ = (uint)(byte)(uVar39 >> 7) * 0x219392ef;
  auVar70 = vandps_avx(ZEXT1632(auVar43),auVar94);
  uVar39 = vcmpps_avx512vl(auVar70,auVar188,1);
  bVar41 = (bool)((byte)uVar39 & 1);
  auVar86._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar43._0_4_;
  bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar43._4_4_;
  bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar43._8_4_;
  bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar43._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar39 >> 7) * 0x219392ef;
  auVar70 = vandps_avx(ZEXT1632(auVar56),auVar94);
  uVar39 = vcmpps_avx512vl(auVar70,auVar188,1);
  bVar41 = (bool)((byte)uVar39 & 1);
  auVar70._0_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar56._0_4_;
  bVar41 = (bool)((byte)(uVar39 >> 1) & 1);
  auVar70._4_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar56._4_4_;
  bVar41 = (bool)((byte)(uVar39 >> 2) & 1);
  auVar70._8_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar56._8_4_;
  bVar41 = (bool)((byte)(uVar39 >> 3) & 1);
  auVar70._12_4_ = (uint)bVar41 * 0x219392ef | (uint)!bVar41 * auVar56._12_4_;
  auVar70._16_4_ = (uint)((byte)(uVar39 >> 4) & 1) * 0x219392ef;
  auVar70._20_4_ = (uint)((byte)(uVar39 >> 5) & 1) * 0x219392ef;
  auVar70._24_4_ = (uint)((byte)(uVar39 >> 6) & 1) * 0x219392ef;
  auVar70._28_4_ = (uint)(byte)(uVar39 >> 7) * 0x219392ef;
  auVar69 = vrcp14ps_avx512vl(auVar67);
  auVar141._8_4_ = 0x3f800000;
  auVar141._0_8_ = &DAT_3f8000003f800000;
  auVar141._12_4_ = 0x3f800000;
  auVar141._16_4_ = 0x3f800000;
  auVar141._20_4_ = 0x3f800000;
  auVar141._24_4_ = 0x3f800000;
  auVar141._28_4_ = 0x3f800000;
  auVar42 = vfnmadd213ps_fma(auVar67,auVar69,auVar141);
  auVar42 = vfmadd132ps_fma(ZEXT1632(auVar42),auVar69,auVar69);
  auVar69 = vrcp14ps_avx512vl(auVar86);
  auVar43 = vfnmadd213ps_fma(auVar86,auVar69,auVar141);
  auVar43 = vfmadd132ps_fma(ZEXT1632(auVar43),auVar69,auVar69);
  auVar69 = vrcp14ps_avx512vl(auVar70);
  auVar56 = vfnmadd213ps_fma(auVar70,auVar69,auVar141);
  auVar56 = vfmadd132ps_fma(ZEXT1632(auVar56),auVar69,auVar69);
  fVar216 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar38 + 0x16)) *
            *(float *)(prim + lVar38 + 0x1a);
  auVar134._4_4_ = fVar216;
  auVar134._0_4_ = fVar216;
  auVar134._8_4_ = fVar216;
  auVar134._12_4_ = fVar216;
  auVar134._16_4_ = fVar216;
  auVar134._20_4_ = fVar216;
  auVar134._24_4_ = fVar216;
  auVar134._28_4_ = fVar216;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 7 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0xb + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar70);
  auVar79 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 9 + 6));
  auVar57 = vfmadd213ps_fma(auVar69,auVar134,auVar70);
  auVar70 = vcvtdq2ps_avx(auVar79);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0xd + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar70);
  auVar62 = vfmadd213ps_fma(auVar69,auVar134,auVar70);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x12 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar39 = (ulong)(uint)((int)(uVar31 * 5) << 2);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 2 + uVar39 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar70);
  auVar63 = vfmadd213ps_fma(auVar69,auVar134,auVar70);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar39 + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x18 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar70);
  auVar64 = vfmadd213ps_fma(auVar69,auVar134,auVar70);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x1d + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 + (ulong)(byte)PVar4 * 0x20 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar70);
  auVar65 = vfmadd213ps_fma(auVar69,auVar134,auVar70);
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar4 * 0x20 - uVar31) + 6));
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar31 * 0x23 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,auVar70);
  auVar44 = vfmadd213ps_fma(auVar69,auVar134,auVar70);
  auVar70 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar96._16_16_));
  auVar81._4_4_ = auVar42._4_4_ * auVar70._4_4_;
  auVar81._0_4_ = auVar42._0_4_ * auVar70._0_4_;
  auVar81._8_4_ = auVar42._8_4_ * auVar70._8_4_;
  auVar81._12_4_ = auVar42._12_4_ * auVar70._12_4_;
  auVar81._16_4_ = auVar70._16_4_ * 0.0;
  auVar81._20_4_ = auVar70._20_4_ * 0.0;
  auVar81._24_4_ = auVar70._24_4_ * 0.0;
  auVar81._28_4_ = auVar70._28_4_;
  auVar70 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar96._16_16_));
  auVar92._0_4_ = auVar42._0_4_ * auVar70._0_4_;
  auVar92._4_4_ = auVar42._4_4_ * auVar70._4_4_;
  auVar92._8_4_ = auVar42._8_4_ * auVar70._8_4_;
  auVar92._12_4_ = auVar42._12_4_ * auVar70._12_4_;
  auVar92._16_4_ = auVar70._16_4_ * 0.0;
  auVar92._20_4_ = auVar70._20_4_ * 0.0;
  auVar92._24_4_ = auVar70._24_4_ * 0.0;
  auVar92._28_4_ = 0;
  auVar70 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar47));
  auVar82._4_4_ = auVar43._4_4_ * auVar70._4_4_;
  auVar82._0_4_ = auVar43._0_4_ * auVar70._0_4_;
  auVar82._8_4_ = auVar43._8_4_ * auVar70._8_4_;
  auVar82._12_4_ = auVar43._12_4_ * auVar70._12_4_;
  auVar82._16_4_ = auVar70._16_4_ * 0.0;
  auVar82._20_4_ = auVar70._20_4_ * 0.0;
  auVar82._24_4_ = auVar70._24_4_ * 0.0;
  auVar82._28_4_ = auVar70._28_4_;
  auVar70 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar47));
  auVar88._0_4_ = auVar43._0_4_ * auVar70._0_4_;
  auVar88._4_4_ = auVar43._4_4_ * auVar70._4_4_;
  auVar88._8_4_ = auVar43._8_4_ * auVar70._8_4_;
  auVar88._12_4_ = auVar43._12_4_ * auVar70._12_4_;
  auVar88._16_4_ = auVar70._16_4_ * 0.0;
  auVar88._20_4_ = auVar70._20_4_ * 0.0;
  auVar88._24_4_ = auVar70._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar70 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar48));
  auVar83._4_4_ = auVar56._4_4_ * auVar70._4_4_;
  auVar83._0_4_ = auVar56._0_4_ * auVar70._0_4_;
  auVar83._8_4_ = auVar56._8_4_ * auVar70._8_4_;
  auVar83._12_4_ = auVar56._12_4_ * auVar70._12_4_;
  auVar83._16_4_ = auVar70._16_4_ * 0.0;
  auVar83._20_4_ = auVar70._20_4_ * 0.0;
  auVar83._24_4_ = auVar70._24_4_ * 0.0;
  auVar83._28_4_ = auVar70._28_4_;
  auVar70 = vsubps_avx(ZEXT1632(auVar44),ZEXT1632(auVar48));
  auVar87._0_4_ = auVar56._0_4_ * auVar70._0_4_;
  auVar87._4_4_ = auVar56._4_4_ * auVar70._4_4_;
  auVar87._8_4_ = auVar56._8_4_ * auVar70._8_4_;
  auVar87._12_4_ = auVar56._12_4_ * auVar70._12_4_;
  auVar87._16_4_ = auVar70._16_4_ * 0.0;
  auVar87._20_4_ = auVar70._20_4_ * 0.0;
  auVar87._24_4_ = auVar70._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar70 = vpminsd_avx2(auVar81,auVar92);
  auVar69 = vpminsd_avx2(auVar82,auVar88);
  auVar70 = vmaxps_avx(auVar70,auVar69);
  auVar69 = vpminsd_avx2(auVar83,auVar87);
  uVar108 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar79._4_4_ = uVar108;
  auVar79._0_4_ = uVar108;
  auVar79._8_4_ = uVar108;
  auVar79._12_4_ = uVar108;
  auVar79._16_4_ = uVar108;
  auVar79._20_4_ = uVar108;
  auVar79._24_4_ = uVar108;
  auVar79._28_4_ = uVar108;
  auVar69 = vmaxps_avx512vl(auVar69,auVar79);
  auVar70 = vmaxps_avx(auVar70,auVar69);
  auVar69._8_4_ = 0x3f7ffffa;
  auVar69._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar69._12_4_ = 0x3f7ffffa;
  auVar69._16_4_ = 0x3f7ffffa;
  auVar69._20_4_ = 0x3f7ffffa;
  auVar69._24_4_ = 0x3f7ffffa;
  auVar69._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar70,auVar69);
  auVar70 = vpmaxsd_avx2(auVar81,auVar92);
  auVar69 = vpmaxsd_avx2(auVar82,auVar88);
  auVar70 = vminps_avx(auVar70,auVar69);
  auVar69 = vpmaxsd_avx2(auVar83,auVar87);
  fVar216 = ray->tfar;
  auVar90._4_4_ = fVar216;
  auVar90._0_4_ = fVar216;
  auVar90._8_4_ = fVar216;
  auVar90._12_4_ = fVar216;
  auVar90._16_4_ = fVar216;
  auVar90._20_4_ = fVar216;
  auVar90._24_4_ = fVar216;
  auVar90._28_4_ = fVar216;
  auVar69 = vminps_avx512vl(auVar69,auVar90);
  auVar70 = vminps_avx(auVar70,auVar69);
  auVar91._8_4_ = 0x3f800003;
  auVar91._0_8_ = 0x3f8000033f800003;
  auVar91._12_4_ = 0x3f800003;
  auVar91._16_4_ = 0x3f800003;
  auVar91._20_4_ = 0x3f800003;
  auVar91._24_4_ = 0x3f800003;
  auVar91._28_4_ = 0x3f800003;
  auVar70 = vmulps_avx512vl(auVar70,auVar91);
  auVar69 = vpbroadcastd_avx512vl();
  uVar16 = vpcmpgtd_avx512vl(auVar69,_DAT_0205a920);
  uVar14 = vcmpps_avx512vl(local_b8,auVar70,2);
  bVar41 = (byte)((byte)uVar14 & (byte)uVar16) == 0;
  local_389 = !bVar41;
  if (bVar41) {
    return local_389;
  }
  uVar39 = (ulong)(byte)((byte)uVar14 & (byte)uVar16);
  auVar96._16_16_ = auVar69._16_16_;
  auVar42 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar259 = ZEXT1664(auVar42);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar251 = ZEXT1664(auVar42);
  local_2e0 = prim;
LAB_01ef3a8f:
  lVar38 = 0;
  for (uVar31 = uVar39; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    lVar38 = lVar38 + 1;
  }
  uVar40 = *(uint *)(local_2e0 + 2);
  pGVar6 = (context->scene->geometries).items[uVar40].ptr;
  fVar216 = (pGVar6->time_range).lower;
  local_2e8 = (ulong)*(uint *)(local_2e0 + lVar38 * 4 + 6);
  fVar216 = pGVar6->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar216) / ((pGVar6->time_range).upper - fVar216));
  auVar42 = vroundss_avx(ZEXT416((uint)fVar216),ZEXT416((uint)fVar216),9);
  auVar43 = vaddss_avx512f(ZEXT416((uint)pGVar6->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar42 = vminss_avx(auVar42,auVar43);
  auVar44 = vmaxss_avx512f(auVar259._0_16_,auVar42);
  uVar31 = (ulong)*(uint *)(*(long *)&pGVar6->field_0x58 +
                           local_2e8 *
                           pGVar6[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var7 = pGVar6[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar34 = (long)(int)auVar44._0_4_ * 0x38;
  lVar36 = *(long *)(_Var7 + 0x10 + lVar34);
  auVar42 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar34) + lVar36 * uVar31);
  lVar38 = uVar31 + 1;
  auVar43 = *(undefined1 (*) [16])(*(long *)(_Var7 + lVar34) + lVar36 * lVar38);
  lVar36 = *(long *)&pGVar6[4].fnumTimeSegments;
  lVar8 = *(long *)(lVar36 + 0x10 + lVar34);
  auVar56 = *(undefined1 (*) [16])(*(long *)(lVar36 + lVar34) + lVar8 * uVar31);
  p_Var9 = pGVar6[4].occlusionFilterN;
  auVar57 = *(undefined1 (*) [16])(*(long *)(lVar36 + lVar34) + lVar8 * lVar38);
  _Var10 = pGVar6[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar8 = *(long *)(_Var10 + 0x10 + lVar34);
  lVar11 = *(long *)(_Var7 + 0x38 + lVar34);
  lVar12 = *(long *)(_Var7 + 0x48 + lVar34);
  auVar62 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar31);
  auVar63 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar38);
  lVar11 = *(long *)(lVar36 + 0x38 + lVar34);
  lVar36 = *(long *)(lVar36 + 0x48 + lVar34);
  auVar64 = *(undefined1 (*) [16])(lVar11 + lVar36 * uVar31);
  auVar65 = *(undefined1 (*) [16])(lVar11 + lVar36 * lVar38);
  lVar36 = *(long *)(_Var10 + 0x38 + lVar34);
  lVar11 = *(long *)(_Var10 + 0x48 + lVar34);
  auVar45 = vsubss_avx512f(ZEXT416((uint)fVar216),auVar44);
  auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar44 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar34) + *(long *)(p_Var9 + lVar34 + 0x10) * uVar31),
                       auVar42,auVar46);
  auVar47 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar34) + *(long *)(p_Var9 + lVar34 + 0x10) * lVar38),
                       auVar43,auVar46);
  auVar48 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var10 + lVar34) + lVar8 * uVar31),auVar56,
                       auVar46);
  auVar49 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])(*(long *)(_Var10 + lVar34) + lVar8 * lVar38),auVar57,
                       auVar46);
  auVar72._0_16_ = vxorps_avx512vl(in_ZMM25._0_16_,in_ZMM25._0_16_);
  auVar50 = vmulps_avx512vl(auVar43,auVar72._0_16_);
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar47,auVar72._0_16_);
  auVar51 = vxorps_avx512vl(auVar250._0_16_,auVar250._0_16_);
  auVar51 = vfmadd213ps_avx512vl(auVar51,auVar44,auVar50);
  auVar51 = vaddps_avx512vl(auVar42,auVar51);
  auVar148 = auVar251._0_16_;
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar44,auVar148);
  auVar50 = vfnmadd231ps_avx512vl(auVar50,auVar42,auVar148);
  auVar52 = vmulps_avx512vl(auVar57,auVar72._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar49,auVar72._0_16_);
  auVar53 = vxorps_avx512vl(auVar148,auVar148);
  auVar53 = vfmadd213ps_avx512vl(auVar53,auVar48,auVar52);
  auVar54 = vaddps_avx512vl(auVar56,auVar53);
  auVar52 = vfmadd231ps_avx512vl(auVar52,auVar48,auVar148);
  auVar52 = vfnmadd231ps_avx512vl(auVar52,auVar56,auVar148);
  auVar53 = vxorps_avx512vl(auVar53,auVar53);
  auVar53 = vfmadd213ps_avx512vl(auVar53,auVar47,auVar43);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar44,auVar72._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar53,auVar42,auVar72._0_16_);
  auVar43 = vmulps_avx512vl(auVar43,auVar148);
  auVar43 = vfnmadd231ps_avx512vl(auVar43,auVar148,auVar47);
  auVar43 = vfmadd231ps_avx512vl(auVar43,auVar72._0_16_,auVar44);
  auVar55 = vfnmadd231ps_avx512vl(auVar43,auVar72._0_16_,auVar42);
  auVar42 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar49,auVar57);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar48,auVar72._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar56,auVar72._0_16_);
  fVar216 = auVar251._0_4_;
  auVar60._0_4_ = auVar57._0_4_ * fVar216;
  fVar199 = auVar251._4_4_;
  auVar60._4_4_ = auVar57._4_4_ * fVar199;
  fVar211 = auVar251._8_4_;
  auVar60._8_4_ = auVar57._8_4_ * fVar211;
  fVar212 = auVar251._12_4_;
  auVar60._12_4_ = auVar57._12_4_ * fVar212;
  auVar42 = vfnmadd231ps_fma(auVar60,auVar148,auVar49);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar72._0_16_,auVar48);
  auVar47 = vfnmadd231ps_avx512vl(auVar42,auVar72._0_16_,auVar56);
  auVar42 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar56 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  fVar119 = auVar50._0_4_;
  auVar61._0_4_ = fVar119 * auVar56._0_4_;
  fVar127 = auVar50._4_4_;
  auVar61._4_4_ = fVar127 * auVar56._4_4_;
  fVar143 = auVar50._8_4_;
  auVar61._8_4_ = fVar143 * auVar56._8_4_;
  fVar144 = auVar50._12_4_;
  auVar61._12_4_ = fVar144 * auVar56._12_4_;
  auVar56 = vfmsub231ps_avx512vl(auVar61,auVar42,auVar54);
  auVar56 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar57 = vshufps_avx512vl(auVar52,auVar52,0xc9);
  auVar157._0_4_ = fVar119 * auVar57._0_4_;
  auVar157._4_4_ = fVar127 * auVar57._4_4_;
  auVar157._8_4_ = fVar143 * auVar57._8_4_;
  auVar157._12_4_ = fVar144 * auVar57._12_4_;
  auVar42 = vfmsub231ps_avx512vl(auVar157,auVar42,auVar52);
  auVar57 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar48 = vshufps_avx512vl(auVar55,auVar55,0xc9);
  auVar42 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar42 = vmulps_avx512vl(auVar55,auVar42);
  auVar42 = vfmsub231ps_fma(auVar42,auVar48,auVar43);
  auVar44 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar42 = vmulps_avx512vl(auVar55,auVar42);
  auVar42 = vfmsub231ps_fma(auVar42,auVar48,auVar47);
  auVar47 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar56,auVar56,0x7f);
  auVar72._16_16_ = auVar96._16_16_;
  auVar71._4_28_ = auVar72._4_28_;
  auVar71._0_4_ = auVar42._0_4_;
  auVar43 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar71._0_16_);
  auVar48 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar49 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  auVar49 = vmulss_avx512f(auVar49,auVar43);
  auVar43 = vmulss_avx512f(auVar49,ZEXT416((uint)(auVar43._0_4_ * auVar43._0_4_)));
  fVar215 = auVar48._0_4_ - auVar43._0_4_;
  auVar43 = vdpps_avx(auVar56,auVar57,0x7f);
  auVar178._4_4_ = fVar215;
  auVar178._0_4_ = fVar215;
  auVar178._8_4_ = fVar215;
  auVar178._12_4_ = fVar215;
  auVar48 = vmulps_avx512vl(auVar56,auVar178);
  auVar49 = vbroadcastss_avx512vl(auVar42);
  auVar57 = vmulps_avx512vl(auVar49,auVar57);
  fVar213 = auVar43._0_4_;
  auVar145._0_4_ = fVar213 * auVar56._0_4_;
  auVar145._4_4_ = fVar213 * auVar56._4_4_;
  auVar145._8_4_ = fVar213 * auVar56._8_4_;
  auVar145._12_4_ = fVar213 * auVar56._12_4_;
  auVar56 = vsubps_avx(auVar57,auVar145);
  auVar43 = vrcp14ss_avx512f(auVar72._0_16_,auVar71._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar43,ZEXT416(0x40000000));
  fVar213 = auVar43._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar44,auVar44,0x7f);
  auVar74._16_16_ = auVar96._16_16_;
  auVar74._0_16_ = auVar72._0_16_;
  auVar73._4_28_ = auVar74._4_28_;
  auVar73._0_4_ = auVar42._0_4_;
  auVar43 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar73._0_16_);
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar49 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  fVar214 = auVar43._0_4_;
  fVar110 = auVar57._0_4_ - auVar49._0_4_ * fVar214 * fVar214 * fVar214;
  auVar43 = vdpps_avx(auVar44,auVar47,0x7f);
  auVar190._0_4_ = auVar44._0_4_ * fVar110;
  auVar190._4_4_ = auVar44._4_4_ * fVar110;
  auVar190._8_4_ = auVar44._8_4_ * fVar110;
  auVar190._12_4_ = auVar44._12_4_ * fVar110;
  auVar57 = vbroadcastss_avx512vl(auVar42);
  auVar57 = vmulps_avx512vl(auVar57,auVar47);
  fVar214 = auVar43._0_4_;
  auVar49._0_4_ = fVar214 * auVar44._0_4_;
  auVar49._4_4_ = fVar214 * auVar44._4_4_;
  auVar49._8_4_ = fVar214 * auVar44._8_4_;
  auVar49._12_4_ = fVar214 * auVar44._12_4_;
  auVar43 = vsubps_avx(auVar57,auVar49);
  auVar57 = vrcp14ss_avx512f(auVar72._0_16_,auVar73._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar57,ZEXT416(0x40000000));
  fVar214 = auVar57._0_4_ * auVar42._0_4_;
  auVar57 = vshufps_avx512vl(auVar51,auVar51,0xff);
  auVar44 = vmulps_avx512vl(auVar57,auVar48);
  auVar49 = vsubps_avx512vl(auVar51,auVar44);
  auVar42 = vshufps_avx(auVar50,auVar50,0xff);
  auVar42 = vmulps_avx512vl(auVar42,auVar48);
  auVar146._0_4_ = auVar42._0_4_ + auVar57._0_4_ * fVar215 * fVar213 * auVar56._0_4_;
  auVar146._4_4_ = auVar42._4_4_ + auVar57._4_4_ * fVar215 * fVar213 * auVar56._4_4_;
  auVar146._8_4_ = auVar42._8_4_ + auVar57._8_4_ * fVar215 * fVar213 * auVar56._8_4_;
  auVar146._12_4_ = auVar42._12_4_ + auVar57._12_4_ * fVar215 * fVar213 * auVar56._12_4_;
  auVar42 = vsubps_avx(auVar50,auVar146);
  auVar50 = vaddps_avx512vl(auVar51,auVar44);
  auVar147._0_4_ = fVar119 + auVar146._0_4_;
  auVar147._4_4_ = fVar127 + auVar146._4_4_;
  auVar147._8_4_ = fVar143 + auVar146._8_4_;
  auVar147._12_4_ = fVar144 + auVar146._12_4_;
  auVar56 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar179._0_4_ = auVar190._0_4_ * auVar56._0_4_;
  auVar179._4_4_ = auVar190._4_4_ * auVar56._4_4_;
  auVar179._8_4_ = auVar190._8_4_ * auVar56._8_4_;
  auVar179._12_4_ = auVar190._12_4_ * auVar56._12_4_;
  auVar51 = vsubps_avx512vl(auVar53,auVar179);
  auVar57 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar44 = vmulps_avx512vl(auVar57,auVar190);
  auVar158._0_4_ = auVar44._0_4_ + auVar56._0_4_ * fVar110 * auVar43._0_4_ * fVar214;
  auVar158._4_4_ = auVar44._4_4_ + auVar56._4_4_ * fVar110 * auVar43._4_4_ * fVar214;
  auVar158._8_4_ = auVar44._8_4_ + auVar56._8_4_ * fVar110 * auVar43._8_4_ * fVar214;
  auVar158._12_4_ = auVar44._12_4_ + auVar56._12_4_ * fVar110 * auVar43._12_4_ * fVar214;
  auVar43 = vsubps_avx512vl(auVar55,auVar158);
  auVar52 = vaddps_avx512vl(auVar53,auVar179);
  auVar56 = vaddps_avx512vl(auVar55,auVar158);
  auVar42 = vmulps_avx512vl(auVar42,auVar46);
  auVar166._0_4_ = auVar49._0_4_ + auVar42._0_4_;
  auVar166._4_4_ = auVar49._4_4_ + auVar42._4_4_;
  auVar166._8_4_ = auVar49._8_4_ + auVar42._8_4_;
  auVar166._12_4_ = auVar49._12_4_ + auVar42._12_4_;
  auVar42 = vmulps_avx512vl(auVar43,auVar46);
  auVar44 = vsubps_avx(auVar51,auVar42);
  auVar42 = vmulps_avx512vl(auVar147,auVar46);
  auVar54 = vaddps_avx512vl(auVar50,auVar42);
  auVar42 = vmulps_avx512vl(auVar56,auVar46);
  auVar47 = vsubps_avx(auVar52,auVar42);
  auVar43 = vfmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar34 + 0x38) +
                        *(long *)(p_Var9 + lVar34 + 0x48) * uVar31),auVar62,auVar46);
  auVar56 = vfnmadd132ps_avx512vl
                      (*(undefined1 (*) [16])
                        (*(long *)(p_Var9 + lVar34 + 0x38) +
                        *(long *)(p_Var9 + lVar34 + 0x48) * lVar38),auVar63,auVar46);
  auVar55 = vfmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar36 + uVar31 * lVar11),auVar64,auVar46);
  auVar58 = vfnmadd132ps_avx512vl(*(undefined1 (*) [16])(lVar36 + lVar11 * lVar38),auVar65,auVar46);
  auVar42 = vmulps_avx512vl(auVar63,auVar72._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar56,auVar72._0_16_);
  auVar57 = vxorps_avx512vl(auVar57,auVar57);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar43,auVar42);
  auVar59 = vaddps_avx512vl(auVar62,auVar57);
  auVar42 = vfmadd231ps_fma(auVar42,auVar43,auVar148);
  auVar48 = vfnmadd231ps_fma(auVar42,auVar62,auVar148);
  auVar42 = vmulps_avx512vl(auVar65,auVar72._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar58,auVar72._0_16_);
  auVar57 = vxorps_avx512vl(auVar53,auVar53);
  auVar57 = vfmadd213ps_avx512vl(auVar57,auVar55,auVar42);
  auVar53 = vaddps_avx512vl(auVar64,auVar57);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar55,auVar148);
  auVar60 = vfnmadd231ps_avx512vl(auVar42,auVar64,auVar148);
  auVar42 = vxorps_avx512vl(auVar57,auVar57);
  auVar42 = vfmadd213ps_avx512vl(auVar42,auVar56,auVar63);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar43,auVar72._0_16_);
  auVar61 = vfmadd231ps_avx512vl(auVar42,auVar62,auVar72._0_16_);
  auVar225._0_4_ = auVar63._0_4_ * fVar216;
  auVar225._4_4_ = auVar63._4_4_ * fVar199;
  auVar225._8_4_ = auVar63._8_4_ * fVar211;
  auVar225._12_4_ = auVar63._12_4_ * fVar212;
  auVar42 = vfnmadd231ps_fma(auVar225,auVar148,auVar56);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar72._0_16_,auVar43);
  auVar62 = vfnmadd231ps_avx512vl(auVar42,auVar72._0_16_,auVar62);
  auVar42 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar58,auVar65);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar55,auVar72._0_16_);
  auVar43 = vfmadd231ps_avx512vl(auVar42,auVar64,auVar72._0_16_);
  auVar231._0_4_ = auVar65._0_4_ * fVar216;
  auVar231._4_4_ = auVar65._4_4_ * fVar199;
  auVar231._8_4_ = auVar65._8_4_ * fVar211;
  auVar231._12_4_ = auVar65._12_4_ * fVar212;
  auVar42 = vfnmadd231ps_avx512vl(auVar231,auVar148,auVar58);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar72._0_16_,auVar55);
  auVar63 = vfnmadd231ps_avx512vl(auVar42,auVar72._0_16_,auVar64);
  auVar42 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar56 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  fVar199 = auVar48._0_4_;
  auVar237._0_4_ = fVar199 * auVar56._0_4_;
  fVar211 = auVar48._4_4_;
  auVar237._4_4_ = fVar211 * auVar56._4_4_;
  fVar212 = auVar48._8_4_;
  auVar237._8_4_ = fVar212 * auVar56._8_4_;
  fVar213 = auVar48._12_4_;
  auVar237._12_4_ = fVar213 * auVar56._12_4_;
  auVar56 = vfmsub231ps_avx512vl(auVar237,auVar42,auVar53);
  auVar56 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar57 = vshufps_avx512vl(auVar60,auVar60,0xc9);
  auVar245._0_4_ = fVar199 * auVar57._0_4_;
  auVar245._4_4_ = fVar211 * auVar57._4_4_;
  auVar245._8_4_ = fVar212 * auVar57._8_4_;
  auVar245._12_4_ = fVar213 * auVar57._12_4_;
  auVar42 = vfmsub231ps_avx512vl(auVar245,auVar42,auVar60);
  auVar57 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar42 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar64 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar64 = vmulps_avx512vl(auVar62,auVar64);
  auVar43 = vfmsub231ps_avx512vl(auVar64,auVar42,auVar43);
  auVar64 = vshufps_avx512vl(auVar43,auVar43,0xc9);
  auVar43 = vshufps_avx512vl(auVar63,auVar63,0xc9);
  auVar43 = vmulps_avx512vl(auVar62,auVar43);
  auVar42 = vfmsub231ps_avx512vl(auVar43,auVar42,auVar63);
  auVar63 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  auVar42 = vdpps_avx(auVar56,auVar56,0x7f);
  auVar76._16_16_ = auVar96._16_16_;
  auVar76._0_16_ = auVar72._0_16_;
  auVar75._4_28_ = auVar76._4_28_;
  auVar75._0_4_ = auVar42._0_4_;
  auVar43 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar75._0_16_);
  auVar65 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar53 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  auVar53 = vmulss_avx512f(auVar53,auVar43);
  auVar43 = vmulss_avx512f(auVar43,auVar43);
  auVar43 = vmulss_avx512f(auVar53,auVar43);
  auVar43 = vsubss_avx512f(auVar65,auVar43);
  auVar65 = vbroadcastss_avx512vl(auVar43);
  auVar53 = vmulps_avx512vl(auVar56,auVar65);
  auVar43 = vdpps_avx(auVar56,auVar57,0x7f);
  auVar55 = vbroadcastss_avx512vl(auVar42);
  auVar57 = vmulps_avx512vl(auVar55,auVar57);
  fVar216 = auVar43._0_4_;
  auVar55._0_4_ = auVar56._0_4_ * fVar216;
  auVar55._4_4_ = auVar56._4_4_ * fVar216;
  auVar55._8_4_ = auVar56._8_4_ * fVar216;
  auVar55._12_4_ = auVar56._12_4_ * fVar216;
  auVar43 = vsubps_avx(auVar57,auVar55);
  auVar56 = vrcp14ss_avx512f(auVar72._0_16_,auVar75._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar56,ZEXT416(0x40000000));
  fVar216 = auVar56._0_4_ * auVar42._0_4_;
  auVar42 = vdpps_avx(auVar64,auVar64,0x7f);
  auVar58._0_4_ = fVar216 * auVar43._0_4_;
  auVar58._4_4_ = fVar216 * auVar43._4_4_;
  auVar58._8_4_ = fVar216 * auVar43._8_4_;
  auVar58._12_4_ = fVar216 * auVar43._12_4_;
  auVar56 = vmulps_avx512vl(auVar65,auVar58);
  auVar78._16_16_ = auVar96._16_16_;
  auVar78._0_16_ = auVar72._0_16_;
  auVar77._4_28_ = auVar78._4_28_;
  auVar77._0_4_ = auVar42._0_4_;
  auVar43 = vrsqrt14ss_avx512f(auVar72._0_16_,auVar77._0_16_);
  auVar57 = vmulss_avx512f(auVar43,ZEXT416(0x3fc00000));
  auVar65 = vmulss_avx512f(auVar42,ZEXT416(0x3f000000));
  auVar55 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar256 = ZEXT1664(auVar55);
  auVar65 = vmulss_avx512f(auVar65,auVar43);
  auVar43 = vmulss_avx512f(auVar65,ZEXT416((uint)(auVar43._0_4_ * auVar43._0_4_)));
  auVar43 = vsubss_avx512f(auVar57,auVar43);
  auVar246._0_4_ = auVar43._0_4_;
  auVar246._4_4_ = auVar246._0_4_;
  auVar246._8_4_ = auVar246._0_4_;
  auVar246._12_4_ = auVar246._0_4_;
  auVar57 = vmulps_avx512vl(auVar64,auVar246);
  auVar43 = vdpps_avx(auVar64,auVar63,0x7f);
  auVar65 = vbroadcastss_avx512vl(auVar42);
  auVar63 = vmulps_avx512vl(auVar65,auVar63);
  fVar216 = auVar43._0_4_;
  auVar148._0_4_ = auVar64._0_4_ * fVar216;
  auVar148._4_4_ = auVar64._4_4_ * fVar216;
  auVar148._8_4_ = auVar64._8_4_ * fVar216;
  auVar148._12_4_ = auVar64._12_4_ * fVar216;
  auVar43 = vsubps_avx(auVar63,auVar148);
  auVar63 = vrcp14ss_avx512f(auVar72._0_16_,auVar77._0_16_);
  auVar42 = vfnmadd213ss_avx512f(auVar42,auVar63,ZEXT416(0x40000000));
  auVar254 = ZEXT464(0x3f800000);
  fVar216 = auVar63._0_4_ * auVar42._0_4_;
  auVar63 = vshufps_avx512vl(auVar59,auVar59,0xff);
  auVar64 = vmulps_avx512vl(auVar63,auVar53);
  auVar65 = vsubps_avx512vl(auVar59,auVar64);
  auVar42 = vshufps_avx(auVar48,auVar48,0xff);
  auVar42 = vmulps_avx512vl(auVar42,auVar53);
  auVar53._0_4_ = auVar42._0_4_ + auVar63._0_4_ * auVar56._0_4_;
  auVar53._4_4_ = auVar42._4_4_ + auVar63._4_4_ * auVar56._4_4_;
  auVar53._8_4_ = auVar42._8_4_ + auVar63._8_4_ * auVar56._8_4_;
  auVar53._12_4_ = auVar42._12_4_ + auVar63._12_4_ * auVar56._12_4_;
  auVar42 = vsubps_avx(auVar48,auVar53);
  auVar56 = vaddps_avx512vl(auVar59,auVar64);
  auVar59._0_4_ = fVar199 + auVar53._0_4_;
  auVar59._4_4_ = fVar211 + auVar53._4_4_;
  auVar59._8_4_ = fVar212 + auVar53._8_4_;
  auVar59._12_4_ = fVar213 + auVar53._12_4_;
  auVar63 = vshufps_avx512vl(auVar61,auVar61,0xff);
  auVar64 = vmulps_avx512vl(auVar63,auVar57);
  auVar96._16_16_ = vsubps_avx512vl(auVar61,auVar64);
  auVar48 = vshufps_avx512vl(auVar62,auVar62,0xff);
  auVar57 = vmulps_avx512vl(auVar48,auVar57);
  auVar149._0_4_ = auVar63._0_4_ * auVar246._0_4_ * fVar216 * auVar43._0_4_;
  auVar149._4_4_ = auVar63._4_4_ * auVar246._0_4_ * fVar216 * auVar43._4_4_;
  auVar149._8_4_ = auVar63._8_4_ * auVar246._0_4_ * fVar216 * auVar43._8_4_;
  auVar149._12_4_ = auVar63._12_4_ * auVar246._0_4_ * fVar216 * auVar43._12_4_;
  auVar57 = vaddps_avx512vl(auVar57,auVar149);
  auVar43 = vsubps_avx(auVar62,auVar57);
  auVar63 = vaddps_avx512vl(auVar61,auVar64);
  auVar150._0_4_ = auVar62._0_4_ + auVar57._0_4_;
  auVar150._4_4_ = auVar62._4_4_ + auVar57._4_4_;
  auVar150._8_4_ = auVar62._8_4_ + auVar57._8_4_;
  auVar150._12_4_ = auVar62._12_4_ + auVar57._12_4_;
  auVar42 = vmulps_avx512vl(auVar42,auVar46);
  auVar200._0_4_ = auVar65._0_4_ + auVar42._0_4_;
  auVar200._4_4_ = auVar65._4_4_ + auVar42._4_4_;
  auVar200._8_4_ = auVar65._8_4_ + auVar42._8_4_;
  auVar200._12_4_ = auVar65._12_4_ + auVar42._12_4_;
  auVar42 = vmulps_avx512vl(auVar43,auVar46);
  auVar42 = vsubps_avx(auVar96._16_16_,auVar42);
  auVar43 = vmulps_avx512vl(auVar59,auVar46);
  auVar48._0_4_ = auVar56._0_4_ + auVar43._0_4_;
  auVar48._4_4_ = auVar56._4_4_ + auVar43._4_4_;
  auVar48._8_4_ = auVar56._8_4_ + auVar43._8_4_;
  auVar48._12_4_ = auVar56._12_4_ + auVar43._12_4_;
  auVar43 = vmulps_avx512vl(auVar150,auVar46);
  auVar43 = vsubps_avx(auVar63,auVar43);
  auVar57 = vbroadcastss_avx512vl(auVar45);
  auVar62 = vsubss_avx512f(ZEXT416(0x3f800000),auVar45);
  auVar62 = vbroadcastss_avx512vl(auVar62);
  fVar216 = auVar57._0_4_;
  auVar232._0_4_ = fVar216 * auVar65._0_4_;
  fVar199 = auVar57._4_4_;
  auVar232._4_4_ = fVar199 * auVar65._4_4_;
  fVar211 = auVar57._8_4_;
  auVar232._8_4_ = fVar211 * auVar65._8_4_;
  fVar212 = auVar57._12_4_;
  auVar232._12_4_ = fVar212 * auVar65._12_4_;
  auVar64 = vmulps_avx512vl(auVar57,auVar200);
  auVar42 = vmulps_avx512vl(auVar57,auVar42);
  auVar247._0_4_ = fVar216 * auVar96._16_4_;
  auVar247._4_4_ = fVar199 * auVar96._20_4_;
  auVar247._8_4_ = fVar211 * auVar96._24_4_;
  auVar247._12_4_ = fVar212 * auVar96._28_4_;
  local_238 = vfmadd231ps_avx512vl(auVar232,auVar62,auVar49);
  local_248 = vfmadd231ps_avx512vl(auVar64,auVar62,auVar166);
  local_258 = vfmadd231ps_avx512vl(auVar42,auVar62,auVar44);
  local_268 = vfmadd231ps_avx512vl(auVar247,auVar62,auVar51);
  auVar42 = vmulps_avx512vl(auVar57,auVar56);
  auVar56 = vmulps_avx512vl(auVar57,auVar48);
  auVar43 = vmulps_avx512vl(auVar57,auVar43);
  auVar238._0_4_ = fVar216 * auVar63._0_4_;
  auVar238._4_4_ = fVar199 * auVar63._4_4_;
  auVar238._8_4_ = fVar211 * auVar63._8_4_;
  auVar238._12_4_ = fVar212 * auVar63._12_4_;
  _local_278 = vfmadd231ps_avx512vl(auVar42,auVar62,auVar50);
  _local_288 = vfmadd231ps_avx512vl(auVar56,auVar62,auVar54);
  _local_298 = vfmadd231ps_avx512vl(auVar43,auVar62,auVar47);
  _local_2a8 = vfmadd231ps_avx512vl(auVar238,auVar62,auVar52);
  aVar1 = (ray->org).field_0;
  auVar43 = vsubps_avx(local_238,(undefined1  [16])aVar1);
  uVar108 = auVar43._0_4_;
  auVar46._4_4_ = uVar108;
  auVar46._0_4_ = uVar108;
  auVar46._8_4_ = uVar108;
  auVar46._12_4_ = uVar108;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  aVar2 = (pre->ray_space).vx.field_0;
  aVar3 = (pre->ray_space).vy.field_0;
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  fVar216 = (pre->ray_space).vz.field_0.m128[0];
  fVar199 = (pre->ray_space).vz.field_0.m128[1];
  fVar211 = (pre->ray_space).vz.field_0.m128[2];
  fVar212 = (pre->ray_space).vz.field_0.m128[3];
  auVar45._0_4_ = fVar216 * auVar43._0_4_;
  auVar45._4_4_ = fVar199 * auVar43._4_4_;
  auVar45._8_4_ = fVar211 * auVar43._8_4_;
  auVar45._12_4_ = fVar212 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar42);
  auVar63 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar46);
  auVar43 = vsubps_avx512vl(local_248,(undefined1  [16])aVar1);
  uVar108 = auVar43._0_4_;
  auVar51._4_4_ = uVar108;
  auVar51._0_4_ = uVar108;
  auVar51._8_4_ = uVar108;
  auVar51._12_4_ = uVar108;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar50._0_4_ = fVar216 * auVar43._0_4_;
  auVar50._4_4_ = fVar199 * auVar43._4_4_;
  auVar50._8_4_ = fVar211 * auVar43._8_4_;
  auVar50._12_4_ = fVar212 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar50,(undefined1  [16])aVar3,auVar42);
  auVar64 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar51);
  auVar43 = vsubps_avx512vl(local_258,(undefined1  [16])aVar1);
  uVar108 = auVar43._0_4_;
  auVar159._4_4_ = uVar108;
  auVar159._0_4_ = uVar108;
  auVar159._8_4_ = uVar108;
  auVar159._12_4_ = uVar108;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar52._0_4_ = fVar216 * auVar43._0_4_;
  auVar52._4_4_ = fVar199 * auVar43._4_4_;
  auVar52._8_4_ = fVar211 * auVar43._8_4_;
  auVar52._12_4_ = fVar212 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar52,(undefined1  [16])aVar3,auVar42);
  auVar65 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar159);
  auVar43 = vsubps_avx(local_268,(undefined1  [16])aVar1);
  uVar108 = auVar43._0_4_;
  auVar180._4_4_ = uVar108;
  auVar180._0_4_ = uVar108;
  auVar180._8_4_ = uVar108;
  auVar180._12_4_ = uVar108;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar160._0_4_ = fVar216 * auVar43._0_4_;
  auVar160._4_4_ = fVar199 * auVar43._4_4_;
  auVar160._8_4_ = fVar211 * auVar43._8_4_;
  auVar160._12_4_ = fVar212 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar3,auVar42);
  auVar44 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar180);
  auVar43 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar1);
  uVar108 = auVar43._0_4_;
  auVar191._4_4_ = uVar108;
  auVar191._0_4_ = uVar108;
  auVar191._8_4_ = uVar108;
  auVar191._12_4_ = uVar108;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar181._0_4_ = auVar43._0_4_ * fVar216;
  auVar181._4_4_ = auVar43._4_4_ * fVar199;
  auVar181._8_4_ = auVar43._8_4_ * fVar211;
  auVar181._12_4_ = auVar43._12_4_ * fVar212;
  auVar42 = vfmadd231ps_fma(auVar181,(undefined1  [16])aVar3,auVar42);
  auVar96._16_16_ = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar191);
  auVar43 = vsubps_avx512vl(_local_288,(undefined1  [16])aVar1);
  uVar108 = auVar43._0_4_;
  auVar201._4_4_ = uVar108;
  auVar201._0_4_ = uVar108;
  auVar201._8_4_ = uVar108;
  auVar201._12_4_ = uVar108;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar192._0_4_ = auVar43._0_4_ * fVar216;
  auVar192._4_4_ = auVar43._4_4_ * fVar199;
  auVar192._8_4_ = auVar43._8_4_ * fVar211;
  auVar192._12_4_ = auVar43._12_4_ * fVar212;
  auVar42 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar3,auVar42);
  auVar47 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar201);
  auVar43 = vsubps_avx512vl(_local_298,(undefined1  [16])aVar1);
  uVar108 = auVar43._0_4_;
  auVar217._4_4_ = uVar108;
  auVar217._0_4_ = uVar108;
  auVar217._8_4_ = uVar108;
  auVar217._12_4_ = uVar108;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar202._0_4_ = auVar43._0_4_ * fVar216;
  auVar202._4_4_ = auVar43._4_4_ * fVar199;
  auVar202._8_4_ = auVar43._8_4_ * fVar211;
  auVar202._12_4_ = auVar43._12_4_ * fVar212;
  auVar42 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar3,auVar42);
  auVar48 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar217);
  auVar43 = vsubps_avx(_local_2a8,(undefined1  [16])aVar1);
  uVar108 = auVar43._0_4_;
  auVar218._4_4_ = uVar108;
  auVar218._0_4_ = uVar108;
  auVar218._8_4_ = uVar108;
  auVar218._12_4_ = uVar108;
  auVar42 = vshufps_avx(auVar43,auVar43,0x55);
  auVar43 = vshufps_avx(auVar43,auVar43,0xaa);
  auVar54._0_4_ = fVar216 * auVar43._0_4_;
  auVar54._4_4_ = fVar199 * auVar43._4_4_;
  auVar54._8_4_ = fVar211 * auVar43._8_4_;
  auVar54._12_4_ = fVar212 * auVar43._12_4_;
  auVar42 = vfmadd231ps_fma(auVar54,(undefined1  [16])aVar3,auVar42);
  auVar45 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar218);
  local_338 = vmovlhps_avx512f(auVar63,auVar96._16_16_);
  auVar255 = ZEXT1664(local_338);
  auVar56 = vmovlhps_avx(auVar64,auVar47);
  local_308 = vmovlhps_avx512f(auVar65,auVar48);
  _local_218 = vmovlhps_avx512f(auVar44,auVar45);
  auVar42 = vminps_avx512vl(local_338,auVar56);
  auVar57 = vmaxps_avx512vl(local_338,auVar56);
  auVar43 = vminps_avx512vl(local_308,_local_218);
  auVar43 = vminps_avx(auVar42,auVar43);
  auVar42 = vmaxps_avx512vl(local_308,_local_218);
  auVar42 = vmaxps_avx(auVar57,auVar42);
  auVar57 = vshufpd_avx(auVar43,auVar43,3);
  auVar62 = vshufpd_avx(auVar42,auVar42,3);
  auVar43 = vminps_avx(auVar43,auVar57);
  auVar42 = vmaxps_avx(auVar42,auVar62);
  auVar43 = vandps_avx512vl(auVar43,auVar55);
  auVar42 = vandps_avx512vl(auVar42,auVar55);
  auVar42 = vmaxps_avx(auVar43,auVar42);
  auVar43 = vmovshdup_avx(auVar42);
  auVar42 = vmaxss_avx(auVar43,auVar42);
  lVar38 = uVar39 + 0xff;
  local_198._8_8_ = auVar63._0_8_;
  local_198._0_8_ = auVar63._0_8_;
  local_1a8._8_8_ = auVar64._0_8_;
  local_1a8._0_8_ = auVar64._0_8_;
  local_1b8 = vmovddup_avx512vl(auVar65);
  local_1c8._0_8_ = auVar44._0_8_;
  local_1c8._8_8_ = local_1c8._0_8_;
  register0x00001348 = auVar96._16_8_;
  local_1d8 = auVar96._16_8_;
  register0x00001408 = auVar47._0_8_;
  local_1e8 = auVar47._0_8_;
  register0x00001448 = auVar48._0_8_;
  local_1f8 = auVar48._0_8_;
  register0x00001488 = auVar45._0_8_;
  local_208 = auVar45._0_8_;
  local_228 = ZEXT416((uint)(auVar42._0_4_ * 9.536743e-07));
  local_98 = vbroadcastss_avx512vl(local_228);
  auVar47._8_4_ = 0x80000000;
  auVar47._0_8_ = 0x8000000080000000;
  auVar47._12_4_ = 0x80000000;
  auVar42 = vxorps_avx512vl(local_98._0_16_,auVar47);
  local_78 = auVar42._0_4_;
  uStack_74 = local_78;
  uStack_70 = local_78;
  uStack_6c = local_78;
  uStack_68 = local_78;
  uStack_64 = local_78;
  uStack_60 = local_78;
  uStack_5c = local_78;
  local_e8 = vsubps_avx512vl(auVar56,local_338);
  local_f8 = vsubps_avx512vl(local_308,auVar56);
  local_108 = vsubps_avx512vl(_local_218,local_308);
  local_118 = vsubps_avx512vl(_local_278,local_238);
  local_128 = vsubps_avx512vl(_local_288,local_248);
  local_138 = vsubps_avx512vl(_local_298,local_258);
  _local_148 = vsubps_avx(_local_2a8,local_268);
  bVar41 = false;
  auVar42 = ZEXT816(0x3f80000000000000);
  auVar250 = ZEXT1664(auVar42);
  uVar31 = 0;
  do {
    auVar257 = ZEXT3264(local_98);
    auVar96._16_16_ = auVar250._0_16_;
    auVar43 = vshufps_avx(auVar96._16_16_,auVar96._16_16_,0x50);
    auVar233._8_4_ = 0x3f800000;
    auVar233._0_8_ = &DAT_3f8000003f800000;
    auVar233._12_4_ = 0x3f800000;
    auVar236._16_4_ = 0x3f800000;
    auVar236._0_16_ = auVar233;
    auVar236._20_4_ = 0x3f800000;
    auVar236._24_4_ = 0x3f800000;
    auVar236._28_4_ = 0x3f800000;
    auVar57 = vsubps_avx(auVar233,auVar43);
    fVar216 = auVar43._0_4_;
    auVar128._0_4_ = local_1d8._0_4_ * fVar216;
    fVar199 = auVar43._4_4_;
    auVar128._4_4_ = local_1d8._4_4_ * fVar199;
    fVar211 = auVar43._8_4_;
    auVar128._8_4_ = local_1d8._8_4_ * fVar211;
    fVar212 = auVar43._12_4_;
    auVar128._12_4_ = local_1d8._12_4_ * fVar212;
    auVar137._0_4_ = local_1e8._0_4_ * fVar216;
    auVar137._4_4_ = local_1e8._4_4_ * fVar199;
    auVar137._8_4_ = local_1e8._8_4_ * fVar211;
    auVar137._12_4_ = local_1e8._12_4_ * fVar212;
    auVar151._0_4_ = local_1f8._0_4_ * fVar216;
    auVar151._4_4_ = local_1f8._4_4_ * fVar199;
    auVar151._8_4_ = local_1f8._8_4_ * fVar211;
    auVar151._12_4_ = local_1f8._12_4_ * fVar212;
    auVar111._0_4_ = local_208._0_4_ * fVar216;
    auVar111._4_4_ = local_208._4_4_ * fVar199;
    auVar111._8_4_ = local_208._8_4_ * fVar211;
    auVar111._12_4_ = local_208._12_4_ * fVar212;
    auVar62 = vfmadd231ps_fma(auVar128,auVar57,local_198);
    auVar63 = vfmadd231ps_fma(auVar137,auVar57,local_1a8);
    auVar64 = vfmadd231ps_avx512vl(auVar151,auVar57,local_1b8);
    auVar57 = vfmadd231ps_fma(auVar111,local_1c8,auVar57);
    auVar43 = vmovshdup_avx(auVar42);
    fVar199 = auVar42._0_4_;
    fVar216 = (auVar43._0_4_ - fVar199) * 0.04761905;
    auVar177._4_4_ = fVar199;
    auVar177._0_4_ = fVar199;
    auVar177._8_4_ = fVar199;
    auVar177._12_4_ = fVar199;
    auVar177._16_4_ = fVar199;
    auVar177._20_4_ = fVar199;
    auVar177._24_4_ = fVar199;
    auVar177._28_4_ = fVar199;
    auVar124._0_8_ = auVar43._0_8_;
    auVar124._8_8_ = auVar124._0_8_;
    auVar124._16_8_ = auVar124._0_8_;
    auVar124._24_8_ = auVar124._0_8_;
    auVar70 = vsubps_avx(auVar124,auVar177);
    uVar108 = auVar62._0_4_;
    auVar125._4_4_ = uVar108;
    auVar125._0_4_ = uVar108;
    auVar125._8_4_ = uVar108;
    auVar125._12_4_ = uVar108;
    auVar125._16_4_ = uVar108;
    auVar125._20_4_ = uVar108;
    auVar125._24_4_ = uVar108;
    auVar125._28_4_ = uVar108;
    auVar196._8_4_ = 1;
    auVar196._0_8_ = 0x100000001;
    auVar196._12_4_ = 1;
    auVar196._16_4_ = 1;
    auVar196._20_4_ = 1;
    auVar196._24_4_ = 1;
    auVar196._28_4_ = 1;
    auVar90 = ZEXT1632(auVar62);
    auVar69 = vpermps_avx2(auVar196,auVar90);
    auVar79 = vbroadcastss_avx512vl(auVar63);
    auVar91 = ZEXT1632(auVar63);
    auVar80 = vpermps_avx512vl(auVar196,auVar91);
    auVar81 = vbroadcastss_avx512vl(auVar64);
    auVar88 = ZEXT1632(auVar64);
    auVar82 = vpermps_avx512vl(auVar196,auVar88);
    auVar83 = vbroadcastss_avx512vl(auVar57);
    auVar87 = ZEXT1632(auVar57);
    auVar84 = vpermps_avx512vl(auVar196,auVar87);
    auVar197._4_4_ = fVar216;
    auVar197._0_4_ = fVar216;
    auVar197._8_4_ = fVar216;
    auVar197._12_4_ = fVar216;
    auVar197._16_4_ = fVar216;
    auVar197._20_4_ = fVar216;
    auVar197._24_4_ = fVar216;
    auVar197._28_4_ = fVar216;
    auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar68 = vpermps_avx512vl(auVar85,auVar90);
    auVar164._8_4_ = 3;
    auVar164._0_8_ = 0x300000003;
    auVar164._12_4_ = 3;
    auVar164._16_4_ = 3;
    auVar164._20_4_ = 3;
    auVar164._24_4_ = 3;
    auVar164._28_4_ = 3;
    auVar66 = vpermps_avx512vl(auVar164,auVar90);
    auVar67 = vpermps_avx512vl(auVar85,auVar91);
    auVar90 = vpermps_avx2(auVar164,auVar91);
    auVar86 = vpermps_avx512vl(auVar85,auVar88);
    auVar91 = vpermps_avx2(auVar164,auVar88);
    auVar85 = vpermps_avx512vl(auVar85,auVar87);
    auVar87 = vpermps_avx512vl(auVar164,auVar87);
    auVar43 = vfmadd132ps_fma(auVar70,auVar177,_DAT_02020f20);
    auVar70 = vsubps_avx(auVar236,ZEXT1632(auVar43));
    auVar88 = vmulps_avx512vl(auVar79,ZEXT1632(auVar43));
    auVar92 = ZEXT1632(auVar43);
    auVar89 = vmulps_avx512vl(auVar80,auVar92);
    auVar57 = vfmadd231ps_fma(auVar88,auVar70,auVar125);
    auVar62 = vfmadd231ps_fma(auVar89,auVar70,auVar69);
    auVar88 = vmulps_avx512vl(auVar81,auVar92);
    auVar89 = vmulps_avx512vl(auVar82,auVar92);
    auVar79 = vfmadd231ps_avx512vl(auVar88,auVar70,auVar79);
    auVar80 = vfmadd231ps_avx512vl(auVar89,auVar70,auVar80);
    auVar88 = vmulps_avx512vl(auVar83,auVar92);
    auVar89 = ZEXT1632(auVar43);
    auVar84 = vmulps_avx512vl(auVar84,auVar89);
    auVar81 = vfmadd231ps_avx512vl(auVar88,auVar70,auVar81);
    auVar82 = vfmadd231ps_avx512vl(auVar84,auVar70,auVar82);
    fVar211 = auVar43._0_4_;
    fVar212 = auVar43._4_4_;
    auVar21._4_4_ = fVar212 * auVar79._4_4_;
    auVar21._0_4_ = fVar211 * auVar79._0_4_;
    fVar213 = auVar43._8_4_;
    auVar21._8_4_ = fVar213 * auVar79._8_4_;
    fVar214 = auVar43._12_4_;
    auVar21._12_4_ = fVar214 * auVar79._12_4_;
    auVar21._16_4_ = auVar79._16_4_ * 0.0;
    auVar21._20_4_ = auVar79._20_4_ * 0.0;
    auVar21._24_4_ = auVar79._24_4_ * 0.0;
    auVar21._28_4_ = fVar199;
    auVar22._4_4_ = fVar212 * auVar80._4_4_;
    auVar22._0_4_ = fVar211 * auVar80._0_4_;
    auVar22._8_4_ = fVar213 * auVar80._8_4_;
    auVar22._12_4_ = fVar214 * auVar80._12_4_;
    auVar22._16_4_ = auVar80._16_4_ * 0.0;
    auVar22._20_4_ = auVar80._20_4_ * 0.0;
    auVar22._24_4_ = auVar80._24_4_ * 0.0;
    auVar22._28_4_ = auVar69._28_4_;
    auVar57 = vfmadd231ps_fma(auVar21,auVar70,ZEXT1632(auVar57));
    auVar62 = vfmadd231ps_fma(auVar22,auVar70,ZEXT1632(auVar62));
    auVar117._0_4_ = fVar211 * auVar81._0_4_;
    auVar117._4_4_ = fVar212 * auVar81._4_4_;
    auVar117._8_4_ = fVar213 * auVar81._8_4_;
    auVar117._12_4_ = fVar214 * auVar81._12_4_;
    auVar117._16_4_ = auVar81._16_4_ * 0.0;
    auVar117._20_4_ = auVar81._20_4_ * 0.0;
    auVar117._24_4_ = auVar81._24_4_ * 0.0;
    auVar117._28_4_ = 0;
    auVar23._4_4_ = fVar212 * auVar82._4_4_;
    auVar23._0_4_ = fVar211 * auVar82._0_4_;
    auVar23._8_4_ = fVar213 * auVar82._8_4_;
    auVar23._12_4_ = fVar214 * auVar82._12_4_;
    auVar23._16_4_ = auVar82._16_4_ * 0.0;
    auVar23._20_4_ = auVar82._20_4_ * 0.0;
    auVar23._24_4_ = auVar82._24_4_ * 0.0;
    auVar23._28_4_ = auVar81._28_4_;
    auVar63 = vfmadd231ps_fma(auVar117,auVar70,auVar79);
    auVar64 = vfmadd231ps_fma(auVar23,auVar70,auVar80);
    auVar24._28_4_ = auVar80._28_4_;
    auVar24._0_28_ =
         ZEXT1628(CONCAT412(fVar214 * auVar64._12_4_,
                            CONCAT48(fVar213 * auVar64._8_4_,
                                     CONCAT44(fVar212 * auVar64._4_4_,fVar211 * auVar64._0_4_))));
    auVar65 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar214 * auVar63._12_4_,
                                                 CONCAT48(fVar213 * auVar63._8_4_,
                                                          CONCAT44(fVar212 * auVar63._4_4_,
                                                                   fVar211 * auVar63._0_4_)))),
                              auVar70,ZEXT1632(auVar57));
    auVar44 = vfmadd231ps_fma(auVar24,auVar70,ZEXT1632(auVar62));
    auVar69 = vsubps_avx(ZEXT1632(auVar63),ZEXT1632(auVar57));
    auVar79 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar62));
    auVar80 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar69 = vmulps_avx512vl(auVar69,auVar80);
    auVar79 = vmulps_avx512vl(auVar79,auVar80);
    auVar189._0_4_ = fVar216 * auVar69._0_4_;
    auVar189._4_4_ = fVar216 * auVar69._4_4_;
    auVar189._8_4_ = fVar216 * auVar69._8_4_;
    auVar189._12_4_ = fVar216 * auVar69._12_4_;
    auVar189._16_4_ = fVar216 * auVar69._16_4_;
    auVar189._20_4_ = fVar216 * auVar69._20_4_;
    auVar189._24_4_ = fVar216 * auVar69._24_4_;
    auVar189._28_4_ = 0;
    auVar69 = vmulps_avx512vl(auVar197,auVar79);
    auVar63 = vxorps_avx512vl(auVar83._0_16_,auVar83._0_16_);
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar65),_DAT_0205fd20,ZEXT1632(auVar63));
    auVar81 = vpermt2ps_avx512vl(ZEXT1632(auVar44),_DAT_0205fd20,ZEXT1632(auVar63));
    auVar118._0_4_ = auVar189._0_4_ + auVar65._0_4_;
    auVar118._4_4_ = auVar189._4_4_ + auVar65._4_4_;
    auVar118._8_4_ = auVar189._8_4_ + auVar65._8_4_;
    auVar118._12_4_ = auVar189._12_4_ + auVar65._12_4_;
    auVar118._16_4_ = auVar189._16_4_ + 0.0;
    auVar118._20_4_ = auVar189._20_4_ + 0.0;
    auVar118._24_4_ = auVar189._24_4_ + 0.0;
    auVar118._28_4_ = 0;
    auVar92 = ZEXT1632(auVar63);
    auVar82 = vpermt2ps_avx512vl(auVar189,_DAT_0205fd20,auVar92);
    auVar83 = vaddps_avx512vl(ZEXT1632(auVar44),auVar69);
    auVar84 = vpermt2ps_avx512vl(auVar69,_DAT_0205fd20,auVar92);
    auVar69 = vsubps_avx(auVar79,auVar82);
    auVar82 = vsubps_avx512vl(auVar81,auVar84);
    auVar84 = vmulps_avx512vl(auVar67,auVar89);
    auVar88 = vmulps_avx512vl(auVar90,auVar89);
    auVar84 = vfmadd231ps_avx512vl(auVar84,auVar70,auVar68);
    auVar68 = vfmadd231ps_avx512vl(auVar88,auVar70,auVar66);
    auVar66 = vmulps_avx512vl(auVar86,auVar89);
    auVar88 = vmulps_avx512vl(auVar91,auVar89);
    auVar66 = vfmadd231ps_avx512vl(auVar66,auVar70,auVar67);
    auVar90 = vfmadd231ps_avx512vl(auVar88,auVar70,auVar90);
    auVar85 = vmulps_avx512vl(auVar85,auVar89);
    auVar67 = vmulps_avx512vl(auVar87,auVar89);
    auVar57 = vfmadd231ps_fma(auVar85,auVar70,auVar86);
    auVar62 = vfmadd231ps_fma(auVar67,auVar70,auVar91);
    auVar85 = vmulps_avx512vl(auVar89,auVar66);
    auVar67 = vmulps_avx512vl(ZEXT1632(auVar43),auVar90);
    auVar84 = vfmadd231ps_avx512vl(auVar85,auVar70,auVar84);
    auVar85 = vfmadd231ps_avx512vl(auVar67,auVar70,auVar68);
    auVar68 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar214 * auVar57._12_4_,
                                            CONCAT48(fVar213 * auVar57._8_4_,
                                                     CONCAT44(fVar212 * auVar57._4_4_,
                                                              fVar211 * auVar57._0_4_)))),auVar70,
                         auVar66);
    auVar90 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar214 * auVar62._12_4_,
                                            CONCAT48(fVar213 * auVar62._8_4_,
                                                     CONCAT44(fVar212 * auVar62._4_4_,
                                                              fVar211 * auVar62._0_4_)))),auVar70,
                         auVar90);
    auVar25._4_4_ = fVar212 * auVar68._4_4_;
    auVar25._0_4_ = fVar211 * auVar68._0_4_;
    auVar25._8_4_ = fVar213 * auVar68._8_4_;
    auVar25._12_4_ = fVar214 * auVar68._12_4_;
    auVar25._16_4_ = auVar68._16_4_ * 0.0;
    auVar25._20_4_ = auVar68._20_4_ * 0.0;
    auVar25._24_4_ = auVar68._24_4_ * 0.0;
    auVar25._28_4_ = auVar91._28_4_;
    auVar26._4_4_ = fVar212 * auVar90._4_4_;
    auVar26._0_4_ = fVar211 * auVar90._0_4_;
    auVar26._8_4_ = fVar213 * auVar90._8_4_;
    auVar26._12_4_ = fVar214 * auVar90._12_4_;
    auVar26._16_4_ = auVar90._16_4_ * 0.0;
    auVar26._20_4_ = auVar90._20_4_ * 0.0;
    auVar26._24_4_ = auVar90._24_4_ * 0.0;
    auVar26._28_4_ = auVar86._28_4_;
    auVar91 = vfmadd231ps_avx512vl(auVar25,auVar70,auVar84);
    auVar66 = vfmadd231ps_avx512vl(auVar26,auVar85,auVar70);
    auVar70 = vsubps_avx512vl(auVar68,auVar84);
    auVar90 = vsubps_avx512vl(auVar90,auVar85);
    auVar70 = vmulps_avx512vl(auVar70,auVar80);
    auVar90 = vmulps_avx512vl(auVar90,auVar80);
    fVar199 = fVar216 * auVar70._0_4_;
    fVar211 = fVar216 * auVar70._4_4_;
    auVar27._4_4_ = fVar211;
    auVar27._0_4_ = fVar199;
    fVar212 = fVar216 * auVar70._8_4_;
    auVar27._8_4_ = fVar212;
    fVar213 = fVar216 * auVar70._12_4_;
    auVar27._12_4_ = fVar213;
    fVar214 = fVar216 * auVar70._16_4_;
    auVar27._16_4_ = fVar214;
    fVar215 = fVar216 * auVar70._20_4_;
    auVar27._20_4_ = fVar215;
    fVar216 = fVar216 * auVar70._24_4_;
    auVar27._24_4_ = fVar216;
    auVar27._28_4_ = auVar70._28_4_;
    auVar90 = vmulps_avx512vl(auVar197,auVar90);
    auVar80 = vpermt2ps_avx512vl(auVar91,_DAT_0205fd20,auVar92);
    auVar84 = vpermt2ps_avx512vl(auVar66,_DAT_0205fd20,auVar92);
    auVar198._0_4_ = auVar91._0_4_ + fVar199;
    auVar198._4_4_ = auVar91._4_4_ + fVar211;
    auVar198._8_4_ = auVar91._8_4_ + fVar212;
    auVar198._12_4_ = auVar91._12_4_ + fVar213;
    auVar198._16_4_ = auVar91._16_4_ + fVar214;
    auVar198._20_4_ = auVar91._20_4_ + fVar215;
    auVar198._24_4_ = auVar91._24_4_ + fVar216;
    auVar198._28_4_ = auVar91._28_4_ + auVar70._28_4_;
    auVar70 = vpermt2ps_avx512vl(auVar27,_DAT_0205fd20,ZEXT1632(auVar63));
    auVar85 = vaddps_avx512vl(auVar66,auVar90);
    auVar90 = vpermt2ps_avx512vl(auVar90,_DAT_0205fd20,ZEXT1632(auVar63));
    auVar70 = vsubps_avx(auVar80,auVar70);
    auVar90 = vsubps_avx512vl(auVar84,auVar90);
    auVar134 = ZEXT1632(auVar65);
    auVar68 = vsubps_avx512vl(auVar91,auVar134);
    auVar141 = ZEXT1632(auVar44);
    auVar67 = vsubps_avx512vl(auVar66,auVar141);
    auVar86 = vsubps_avx512vl(auVar80,auVar79);
    auVar68 = vaddps_avx512vl(auVar68,auVar86);
    auVar86 = vsubps_avx512vl(auVar84,auVar81);
    auVar67 = vaddps_avx512vl(auVar67,auVar86);
    auVar86 = vmulps_avx512vl(auVar141,auVar68);
    auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar134,auVar67);
    auVar87 = vmulps_avx512vl(auVar83,auVar68);
    auVar87 = vfnmadd231ps_avx512vl(auVar87,auVar118,auVar67);
    auVar88 = vmulps_avx512vl(auVar82,auVar68);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar69,auVar67);
    auVar89 = vmulps_avx512vl(auVar81,auVar68);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar79,auVar67);
    auVar92 = vmulps_avx512vl(auVar66,auVar68);
    auVar92 = vfnmadd231ps_avx512vl(auVar92,auVar91,auVar67);
    auVar93 = vmulps_avx512vl(auVar85,auVar68);
    auVar93 = vfnmadd231ps_avx512vl(auVar93,auVar198,auVar67);
    auVar94 = vmulps_avx512vl(auVar90,auVar68);
    auVar94 = vfnmadd231ps_avx512vl(auVar94,auVar70,auVar67);
    auVar68 = vmulps_avx512vl(auVar84,auVar68);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar80,auVar67);
    auVar67 = vminps_avx512vl(auVar86,auVar87);
    auVar86 = vmaxps_avx512vl(auVar86,auVar87);
    auVar87 = vminps_avx512vl(auVar88,auVar89);
    auVar67 = vminps_avx512vl(auVar67,auVar87);
    auVar87 = vmaxps_avx512vl(auVar88,auVar89);
    auVar86 = vmaxps_avx512vl(auVar86,auVar87);
    auVar87 = vminps_avx512vl(auVar92,auVar93);
    auVar88 = vmaxps_avx512vl(auVar92,auVar93);
    auVar89 = vminps_avx512vl(auVar94,auVar68);
    auVar87 = vminps_avx512vl(auVar87,auVar89);
    auVar67 = vminps_avx512vl(auVar67,auVar87);
    auVar68 = vmaxps_avx512vl(auVar94,auVar68);
    auVar68 = vmaxps_avx512vl(auVar88,auVar68);
    auVar68 = vmaxps_avx512vl(auVar86,auVar68);
    uVar14 = vcmpps_avx512vl(auVar67,local_98,2);
    auVar28._4_4_ = uStack_74;
    auVar28._0_4_ = local_78;
    auVar28._8_4_ = uStack_70;
    auVar28._12_4_ = uStack_6c;
    auVar28._16_4_ = uStack_68;
    auVar28._20_4_ = uStack_64;
    auVar28._24_4_ = uStack_60;
    auVar28._28_4_ = uStack_5c;
    uVar16 = vcmpps_avx512vl(auVar68,auVar28,5);
    uVar37 = 0;
    bVar29 = (byte)uVar14 & (byte)uVar16 & 0x7f;
    if (bVar29 != 0) {
      auVar68 = vsubps_avx512vl(auVar79,auVar134);
      auVar67 = vsubps_avx512vl(auVar81,auVar141);
      auVar86 = vsubps_avx512vl(auVar80,auVar91);
      auVar68 = vaddps_avx512vl(auVar68,auVar86);
      auVar86 = vsubps_avx512vl(auVar84,auVar66);
      auVar67 = vaddps_avx512vl(auVar67,auVar86);
      auVar86 = vmulps_avx512vl(auVar141,auVar68);
      auVar86 = vfnmadd231ps_avx512vl(auVar86,auVar67,auVar134);
      auVar83 = vmulps_avx512vl(auVar83,auVar68);
      auVar83 = vfnmadd213ps_avx512vl(auVar118,auVar67,auVar83);
      auVar82 = vmulps_avx512vl(auVar82,auVar68);
      auVar82 = vfnmadd213ps_avx512vl(auVar69,auVar67,auVar82);
      auVar69 = vmulps_avx512vl(auVar81,auVar68);
      auVar81 = vfnmadd231ps_avx512vl(auVar69,auVar67,auVar79);
      auVar69 = vmulps_avx512vl(auVar66,auVar68);
      auVar91 = vfnmadd231ps_avx512vl(auVar69,auVar67,auVar91);
      auVar69 = vmulps_avx512vl(auVar85,auVar68);
      auVar85 = vfnmadd213ps_avx512vl(auVar198,auVar67,auVar69);
      auVar69 = vmulps_avx512vl(auVar90,auVar68);
      auVar66 = vfnmadd213ps_avx512vl(auVar70,auVar67,auVar69);
      auVar70 = vmulps_avx512vl(auVar84,auVar68);
      auVar80 = vfnmadd231ps_avx512vl(auVar70,auVar80,auVar67);
      auVar69 = vminps_avx(auVar86,auVar83);
      auVar70 = vmaxps_avx(auVar86,auVar83);
      auVar79 = vminps_avx(auVar82,auVar81);
      auVar79 = vminps_avx(auVar69,auVar79);
      auVar69 = vmaxps_avx(auVar82,auVar81);
      auVar70 = vmaxps_avx(auVar70,auVar69);
      auVar90 = vminps_avx(auVar91,auVar85);
      auVar69 = vmaxps_avx(auVar91,auVar85);
      auVar91 = vminps_avx(auVar66,auVar80);
      auVar90 = vminps_avx(auVar90,auVar91);
      auVar90 = vminps_avx(auVar79,auVar90);
      auVar79 = vmaxps_avx(auVar66,auVar80);
      auVar69 = vmaxps_avx(auVar69,auVar79);
      auVar70 = vmaxps_avx(auVar70,auVar69);
      uVar14 = vcmpps_avx512vl(auVar70,auVar28,5);
      uVar16 = vcmpps_avx512vl(auVar90,local_98,2);
      uVar37 = (uint)(bVar29 & (byte)uVar14 & (byte)uVar16);
    }
    if (uVar37 != 0) {
      auStack_188[uVar31] = uVar37;
      uVar14 = vmovlps_avx(auVar42);
      *(undefined8 *)(&uStack_d8 + uVar31 * 2) = uVar14;
      uVar35 = vmovlps_avx(auVar96._16_16_);
      auStack_58[uVar31] = uVar35;
      uVar31 = (ulong)((int)uVar31 + 1);
    }
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar251 = ZEXT1664(auVar42);
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar252 = ZEXT3264(auVar70);
    auVar96._16_16_ = auVar70._16_16_;
    auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar253 = ZEXT1664(auVar42);
    do {
      auVar250 = ZEXT1664(auVar56);
      in_ZMM25 = ZEXT464(0xb8d1b717);
      auVar62 = auVar259._0_16_;
      auVar42 = auVar251._0_16_;
      auVar43 = auVar253._0_16_;
      auVar57 = in_ZMM25._0_16_;
      if ((int)uVar31 == 0) {
        if (bVar41) {
          return local_389;
        }
        fVar216 = ray->tfar;
        auVar20._4_4_ = fVar216;
        auVar20._0_4_ = fVar216;
        auVar20._8_4_ = fVar216;
        auVar20._12_4_ = fVar216;
        auVar20._16_4_ = fVar216;
        auVar20._20_4_ = fVar216;
        auVar20._24_4_ = fVar216;
        auVar20._28_4_ = fVar216;
        uVar14 = vcmpps_avx512vl(local_b8,auVar20,2);
        uVar40 = (uint)uVar39 & (uint)lVar38 & (uint)uVar14;
        uVar39 = (ulong)uVar40;
        local_389 = uVar40 != 0;
        if (!local_389) {
          return local_389;
        }
        goto LAB_01ef3a8f;
      }
      uVar30 = (int)uVar31 - 1;
      uVar32 = (ulong)uVar30;
      uVar37 = (&uStack_d8)[uVar32 * 2];
      fVar216 = afStack_d4[uVar32 * 2];
      uVar5 = auStack_188[uVar32];
      auVar248._8_8_ = 0;
      auVar248._0_8_ = auStack_58[uVar32];
      auVar250 = ZEXT1664(auVar248);
      lVar36 = 0;
      for (uVar35 = (ulong)uVar5; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
        lVar36 = lVar36 + 1;
      }
      uVar33 = uVar5 - 1 & uVar5;
      auStack_188[uVar32] = uVar33;
      if (uVar33 == 0) {
        uVar31 = (ulong)uVar30;
      }
      auVar64 = vpxord_avx512vl(auVar257._0_16_,auVar257._0_16_);
      auVar63 = vcvtsi2ss_avx512f(auVar64,lVar36);
      auVar65 = vmulss_avx512f(auVar63,SUB6416(ZEXT464(0x3e124925),0));
      lVar36 = lVar36 + 1;
      auVar63 = vpxord_avx512vl(auVar64,auVar64);
      auVar63 = vcvtsi2ss_avx512f(auVar63,lVar36);
      auVar63 = vmulss_avx512f(auVar63,SUB6416(ZEXT464(0x3e124925),0));
      auVar44 = auVar254._0_16_;
      auVar64 = vsubss_avx512f(auVar44,auVar65);
      local_328 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar65._0_4_)),ZEXT416(uVar37),auVar64);
      auVar64 = vsubss_avx512f(auVar44,auVar63);
      auVar63 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar63._0_4_)),ZEXT416(uVar37),auVar64);
      fVar199 = auVar63._0_4_;
      fVar211 = local_328._0_4_;
      fVar216 = fVar199 - fVar211;
      vucomiss_avx512f(ZEXT416((uint)fVar216));
      if (uVar5 == 0 || lVar36 == 0) break;
      auVar257 = ZEXT1664(auVar248);
      auVar64 = vshufps_avx(auVar248,auVar248,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar216));
      uVar37 = (uint)uVar31;
      auVar47 = vsubps_avx512vl(auVar43,auVar64);
      fVar212 = auVar64._0_4_;
      auVar129._0_4_ = fVar212 * (float)local_1d8._0_4_;
      fVar213 = auVar64._4_4_;
      auVar129._4_4_ = fVar213 * (float)local_1d8._4_4_;
      fVar214 = auVar64._8_4_;
      auVar129._8_4_ = fVar214 * fStack_1d0;
      fVar215 = auVar64._12_4_;
      auVar129._12_4_ = fVar215 * fStack_1cc;
      auVar138._0_4_ = fVar212 * (float)local_1e8._0_4_;
      auVar138._4_4_ = fVar213 * (float)local_1e8._4_4_;
      auVar138._8_4_ = fVar214 * fStack_1e0;
      auVar138._12_4_ = fVar215 * fStack_1dc;
      auVar152._0_4_ = fVar212 * (float)local_1f8._0_4_;
      auVar152._4_4_ = fVar213 * (float)local_1f8._4_4_;
      auVar152._8_4_ = fVar214 * fStack_1f0;
      auVar152._12_4_ = fVar215 * fStack_1ec;
      auVar112._0_4_ = fVar212 * (float)local_208._0_4_;
      auVar112._4_4_ = fVar213 * (float)local_208._4_4_;
      auVar112._8_4_ = fVar214 * fStack_200;
      auVar112._12_4_ = fVar215 * fStack_1fc;
      auVar64 = vfmadd231ps_fma(auVar129,auVar47,local_198);
      auVar65 = vfmadd231ps_fma(auVar138,auVar47,local_1a8);
      auVar96._16_16_ = vfmadd231ps_fma(auVar152,auVar47,local_1b8);
      auVar47 = vfmadd231ps_fma(auVar112,auVar47,local_1c8);
      auVar126._16_16_ = auVar64;
      auVar126._0_16_ = auVar64;
      auVar135._16_16_ = auVar65;
      auVar135._0_16_ = auVar65;
      auVar142._16_16_ = auVar96._16_16_;
      auVar142._0_16_ = auVar96._16_16_;
      auVar165._4_4_ = fVar211;
      auVar165._0_4_ = fVar211;
      auVar165._8_4_ = fVar211;
      auVar165._12_4_ = fVar211;
      auVar165._20_4_ = fVar199;
      auVar165._16_4_ = fVar199;
      auVar165._24_4_ = fVar199;
      auVar165._28_4_ = fVar199;
      auVar70 = vsubps_avx(auVar135,auVar126);
      auVar65 = vfmadd213ps_fma(auVar70,auVar165,auVar126);
      auVar70 = vsubps_avx(auVar142,auVar135);
      auVar48 = vfmadd213ps_fma(auVar70,auVar165,auVar135);
      auVar64 = vsubps_avx(auVar47,auVar96._16_16_);
      auVar136._16_16_ = auVar64;
      auVar136._0_16_ = auVar64;
      auVar64 = vfmadd213ps_fma(auVar136,auVar165,auVar142);
      auVar70 = vsubps_avx(ZEXT1632(auVar48),ZEXT1632(auVar65));
      auVar65 = vfmadd213ps_fma(auVar70,auVar165,ZEXT1632(auVar65));
      auVar70 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar48));
      auVar64 = vfmadd213ps_fma(auVar70,auVar165,ZEXT1632(auVar48));
      auVar70 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar65));
      auVar58 = vfmadd231ps_fma(ZEXT1632(auVar65),auVar70,auVar165);
      auVar70 = vmulps_avx512vl(auVar70,auVar252._0_32_);
      auVar96._16_16_ = auVar70._16_16_;
      auVar64 = vmulss_avx512f(ZEXT416((uint)fVar216),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar199 = auVar64._0_4_;
      auVar153._0_8_ =
           CONCAT44(auVar58._4_4_ + fVar199 * auVar70._4_4_,auVar58._0_4_ + fVar199 * auVar70._0_4_)
      ;
      auVar153._8_4_ = auVar58._8_4_ + fVar199 * auVar70._8_4_;
      auVar153._12_4_ = auVar58._12_4_ + fVar199 * auVar70._12_4_;
      auVar130._0_4_ = fVar199 * auVar70._16_4_;
      auVar130._4_4_ = fVar199 * auVar70._20_4_;
      auVar130._8_4_ = fVar199 * auVar70._24_4_;
      auVar130._12_4_ = fVar199 * auVar70._28_4_;
      auVar54 = vsubps_avx((undefined1  [16])0x0,auVar130);
      auVar49 = vshufpd_avx(auVar58,auVar58,3);
      auVar50 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar64 = vsubps_avx(auVar49,auVar58);
      auVar65 = vsubps_avx(auVar50,(undefined1  [16])0x0);
      auVar167._0_4_ = auVar65._0_4_ + auVar64._0_4_;
      auVar167._4_4_ = auVar65._4_4_ + auVar64._4_4_;
      auVar167._8_4_ = auVar65._8_4_ + auVar64._8_4_;
      auVar167._12_4_ = auVar65._12_4_ + auVar64._12_4_;
      auVar64 = vshufps_avx(auVar58,auVar58,0xb1);
      auVar65 = vshufps_avx(auVar153,auVar153,0xb1);
      auVar47 = vshufps_avx(auVar54,auVar54,0xb1);
      auVar48 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar226._4_4_ = auVar167._0_4_;
      auVar226._0_4_ = auVar167._0_4_;
      auVar226._8_4_ = auVar167._0_4_;
      auVar226._12_4_ = auVar167._0_4_;
      auVar45 = vshufps_avx(auVar167,auVar167,0x55);
      fVar199 = auVar45._0_4_;
      auVar182._0_4_ = auVar64._0_4_ * fVar199;
      fVar211 = auVar45._4_4_;
      auVar182._4_4_ = auVar64._4_4_ * fVar211;
      fVar212 = auVar45._8_4_;
      auVar182._8_4_ = auVar64._8_4_ * fVar212;
      fVar213 = auVar45._12_4_;
      auVar182._12_4_ = auVar64._12_4_ * fVar213;
      auVar193._0_4_ = auVar65._0_4_ * fVar199;
      auVar193._4_4_ = auVar65._4_4_ * fVar211;
      auVar193._8_4_ = auVar65._8_4_ * fVar212;
      auVar193._12_4_ = auVar65._12_4_ * fVar213;
      auVar203._0_4_ = auVar47._0_4_ * fVar199;
      auVar203._4_4_ = auVar47._4_4_ * fVar211;
      auVar203._8_4_ = auVar47._8_4_ * fVar212;
      auVar203._12_4_ = auVar47._12_4_ * fVar213;
      auVar168._0_4_ = auVar48._0_4_ * fVar199;
      auVar168._4_4_ = auVar48._4_4_ * fVar211;
      auVar168._8_4_ = auVar48._8_4_ * fVar212;
      auVar168._12_4_ = auVar48._12_4_ * fVar213;
      auVar64 = vfmadd231ps_fma(auVar182,auVar226,auVar58);
      auVar65 = vfmadd231ps_fma(auVar193,auVar226,auVar153);
      auVar45 = vfmadd231ps_fma(auVar203,auVar226,auVar54);
      auVar55 = vfmadd231ps_fma(auVar168,(undefined1  [16])0x0,auVar226);
      auVar46 = vshufpd_avx(auVar64,auVar64,1);
      auVar51 = vshufpd_avx(auVar65,auVar65,1);
      auVar52 = vshufpd_avx(auVar45,auVar45,1);
      auVar53 = vshufpd_avx(auVar55,auVar55,1);
      auVar47 = vminss_avx(auVar64,auVar65);
      auVar64 = vmaxss_avx(auVar65,auVar64);
      auVar48 = vminss_avx(auVar45,auVar55);
      auVar65 = vmaxss_avx(auVar55,auVar45);
      auVar48 = vminss_avx(auVar47,auVar48);
      auVar64 = vmaxss_avx(auVar65,auVar64);
      auVar45 = vminss_avx(auVar46,auVar51);
      auVar65 = vmaxss_avx(auVar51,auVar46);
      auVar46 = vminss_avx(auVar52,auVar53);
      auVar47 = vmaxss_avx(auVar53,auVar52);
      auVar45 = vminss_avx(auVar45,auVar46);
      auVar65 = vmaxss_avx(auVar47,auVar65);
      vucomiss_avx512f(auVar48);
      if ((uVar37 < 5) || (auVar65 = vucomiss_avx512f(auVar57), uVar37 < 5)) {
        auVar64 = vucomiss_avx512f(auVar57);
        uVar14 = vcmpps_avx512vl(auVar45,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar16 = vcmpps_avx512vl(auVar48,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar37 & ((byte)uVar16 | (byte)uVar14)) != 0) goto LAB_01ef4d45;
        uVar14 = vcmpps_avx512vl(auVar57,auVar65,5);
        uVar16 = vcmpps_avx512vl(auVar45,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar16 | (ushort)uVar14) & 1) == 0) goto LAB_01ef4d45;
LAB_01ef599d:
        bVar15 = true;
        auVar250 = ZEXT1664(auVar248);
      }
      else {
LAB_01ef4d45:
        uVar14 = vcmpss_avx512f(auVar48,auVar62,1);
        bVar15 = (bool)((byte)uVar14 & 1);
        iVar107 = auVar254._0_4_;
        fVar199 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar107);
        uVar14 = vcmpss_avx512f(auVar64,auVar62,1);
        bVar15 = (bool)((byte)uVar14 & 1);
        fVar211 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar107);
        bVar15 = fVar199 != fVar211;
        iVar258 = auVar259._0_4_;
        auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar95._4_28_ = auVar96._4_28_;
        auVar95._0_4_ = (uint)bVar15 * iVar258 + (uint)!bVar15 * 0x7f800000;
        auVar47 = auVar95._0_16_;
        auVar98._16_16_ = auVar96._16_16_;
        auVar98._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar97._4_28_ = auVar98._4_28_;
        auVar97._0_4_ = (uint)bVar15 * iVar258 + (uint)!bVar15 * -0x800000;
        auVar57 = auVar97._0_16_;
        uVar14 = vcmpss_avx512f(auVar45,auVar62,1);
        bVar15 = (bool)((byte)uVar14 & 1);
        fVar212 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar107);
        if ((fVar199 != fVar212) || (NAN(fVar199) || NAN(fVar212))) {
          fVar213 = auVar45._0_4_;
          fVar199 = auVar48._0_4_;
          bVar15 = fVar213 == fVar199;
          if ((!bVar15) || (NAN(fVar213) || NAN(fVar199))) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar48 = vxorps_avx512vl(auVar48,auVar19);
            auVar239._0_4_ = auVar48._0_4_ / (fVar213 - fVar199);
            auVar239._4_12_ = auVar48._4_12_;
            auVar48 = vsubss_avx512f(auVar44,auVar239);
            auVar45 = vfmadd213ss_avx512f(auVar48,auVar62,auVar239);
            auVar48 = auVar45;
          }
          else {
            vucomiss_avx512f(auVar62);
            auVar100._16_16_ = auVar96._16_16_;
            auVar100._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar99._4_28_ = auVar100._4_28_;
            auVar99._0_4_ = (uint)bVar15 * iVar258 + (uint)!bVar15 * 0x7f800000;
            auVar45 = auVar99._0_16_;
            auVar48 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar47 = vminss_avx(auVar47,auVar45);
          auVar57 = vmaxss_avx(auVar48,auVar57);
        }
        uVar14 = vcmpss_avx512f(auVar65,auVar62,1);
        bVar15 = (bool)((byte)uVar14 & 1);
        fVar199 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar107);
        if ((fVar211 != fVar199) || (NAN(fVar211) || NAN(fVar199))) {
          fVar213 = auVar65._0_4_;
          fVar211 = auVar64._0_4_;
          bVar15 = fVar213 == fVar211;
          if ((!bVar15) || (NAN(fVar213) || NAN(fVar211))) {
            auVar18._8_4_ = 0x80000000;
            auVar18._0_8_ = 0x8000000080000000;
            auVar18._12_4_ = 0x80000000;
            auVar64 = vxorps_avx512vl(auVar64,auVar18);
            auVar204._0_4_ = auVar64._0_4_ / (fVar213 - fVar211);
            auVar204._4_12_ = auVar64._4_12_;
            auVar64 = vsubss_avx512f(auVar44,auVar204);
            auVar65 = vfmadd213ss_avx512f(auVar64,auVar62,auVar204);
            auVar64 = auVar65;
          }
          else {
            vucomiss_avx512f(auVar62);
            auVar102._16_16_ = auVar96._16_16_;
            auVar102._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar101._4_28_ = auVar102._4_28_;
            auVar101._0_4_ = (uint)bVar15 * iVar258 + (uint)!bVar15 * 0x7f800000;
            auVar65 = auVar101._0_16_;
            auVar64 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar47 = vminss_avx(auVar47,auVar65);
          auVar57 = vmaxss_avx(auVar64,auVar57);
        }
        bVar15 = fVar212 != fVar199;
        auVar64 = vminss_avx512f(auVar47,auVar44);
        auVar104._16_16_ = auVar96._16_16_;
        auVar104._0_16_ = auVar47;
        auVar103._4_28_ = auVar104._4_28_;
        auVar103._0_4_ = (uint)bVar15 * auVar64._0_4_ + (uint)!bVar15 * auVar47._0_4_;
        auVar64 = vmaxss_avx512f(auVar44,auVar57);
        auVar106._16_16_ = auVar96._16_16_;
        auVar106._0_16_ = auVar57;
        auVar105._4_28_ = auVar106._4_28_;
        auVar105._0_4_ = (uint)bVar15 * auVar64._0_4_ + (uint)!bVar15 * auVar57._0_4_;
        auVar57 = vmaxss_avx512f(auVar62,auVar103._0_16_);
        auVar64 = vminss_avx512f(auVar105._0_16_,auVar44);
        bVar15 = true;
        if (auVar64._0_4_ < auVar57._0_4_) goto LAB_01ef599d;
        auVar47 = vmaxss_avx512f(auVar62,ZEXT416((uint)(auVar57._0_4_ + -0.1)));
        auVar51 = vminss_avx512f(ZEXT416((uint)(auVar64._0_4_ + 0.1)),auVar44);
        auVar113._0_8_ = auVar58._0_8_;
        auVar113._8_8_ = auVar113._0_8_;
        auVar194._8_8_ = auVar153._0_8_;
        auVar194._0_8_ = auVar153._0_8_;
        auVar205._8_8_ = auVar54._0_8_;
        auVar205._0_8_ = auVar54._0_8_;
        auVar57 = vshufpd_avx(auVar153,auVar153,3);
        auVar64 = vshufpd_avx(auVar54,auVar54,3);
        auVar65 = vshufps_avx(auVar47,auVar51,0);
        auVar52 = vsubps_avx512vl(auVar43,auVar65);
        fVar199 = auVar65._0_4_;
        auVar234._0_4_ = fVar199 * auVar49._0_4_;
        fVar211 = auVar65._4_4_;
        auVar234._4_4_ = fVar211 * auVar49._4_4_;
        fVar212 = auVar65._8_4_;
        auVar234._8_4_ = fVar212 * auVar49._8_4_;
        fVar213 = auVar65._12_4_;
        auVar234._12_4_ = fVar213 * auVar49._12_4_;
        auVar154._0_4_ = fVar199 * auVar57._0_4_;
        auVar154._4_4_ = fVar211 * auVar57._4_4_;
        auVar154._8_4_ = fVar212 * auVar57._8_4_;
        auVar154._12_4_ = fVar213 * auVar57._12_4_;
        auVar161._0_4_ = fVar199 * auVar64._0_4_;
        auVar161._4_4_ = fVar211 * auVar64._4_4_;
        auVar161._8_4_ = fVar212 * auVar64._8_4_;
        auVar161._12_4_ = fVar213 * auVar64._12_4_;
        auVar131._0_4_ = fVar199 * auVar50._0_4_;
        auVar131._4_4_ = fVar211 * auVar50._4_4_;
        auVar131._8_4_ = fVar212 * auVar50._8_4_;
        auVar131._12_4_ = fVar213 * auVar50._12_4_;
        auVar48 = vfmadd231ps_fma(auVar234,auVar52,auVar113);
        auVar45 = vfmadd231ps_fma(auVar154,auVar52,auVar194);
        auVar46 = vfmadd231ps_fma(auVar161,auVar52,auVar205);
        auVar49 = vfmadd231ps_fma(auVar131,auVar52,ZEXT816(0));
        auVar64 = vsubss_avx512f(auVar44,auVar47);
        auVar57 = vmovshdup_avx(auVar248);
        auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar47._0_4_)),auVar248,auVar64);
        auVar64 = vsubss_avx512f(auVar44,auVar51);
        auVar58 = vfmadd231ss_fma(ZEXT416((uint)(auVar51._0_4_ * auVar57._0_4_)),auVar248,auVar64);
        auVar50 = vdivss_avx512f(auVar44,ZEXT416((uint)fVar216));
        auVar57 = vsubps_avx(auVar45,auVar48);
        auVar65 = vmulps_avx512vl(auVar57,auVar42);
        auVar57 = vsubps_avx(auVar46,auVar45);
        auVar47 = vmulps_avx512vl(auVar57,auVar42);
        auVar57 = vsubps_avx(auVar49,auVar46);
        auVar57 = vmulps_avx512vl(auVar57,auVar42);
        auVar64 = vminps_avx(auVar47,auVar57);
        auVar57 = vmaxps_avx(auVar47,auVar57);
        auVar64 = vminps_avx(auVar65,auVar64);
        auVar57 = vmaxps_avx(auVar65,auVar57);
        auVar65 = vshufpd_avx(auVar64,auVar64,3);
        auVar47 = vshufpd_avx(auVar57,auVar57,3);
        auVar64 = vminps_avx(auVar64,auVar65);
        auVar57 = vmaxps_avx(auVar57,auVar47);
        fVar216 = auVar50._0_4_;
        auVar183._0_4_ = fVar216 * auVar64._0_4_;
        auVar183._4_4_ = fVar216 * auVar64._4_4_;
        auVar183._8_4_ = fVar216 * auVar64._8_4_;
        auVar183._12_4_ = fVar216 * auVar64._12_4_;
        auVar169._0_4_ = fVar216 * auVar57._0_4_;
        auVar169._4_4_ = fVar216 * auVar57._4_4_;
        auVar169._8_4_ = fVar216 * auVar57._8_4_;
        auVar169._12_4_ = fVar216 * auVar57._12_4_;
        auVar50 = vdivss_avx512f(auVar44,ZEXT416((uint)(auVar58._0_4_ - auVar55._0_4_)));
        auVar57 = vshufpd_avx(auVar48,auVar48,3);
        auVar64 = vshufpd_avx(auVar45,auVar45,3);
        auVar65 = vshufpd_avx(auVar46,auVar46,3);
        auVar47 = vshufpd_avx(auVar49,auVar49,3);
        auVar57 = vsubps_avx(auVar57,auVar48);
        auVar48 = vsubps_avx(auVar64,auVar45);
        auVar45 = vsubps_avx(auVar65,auVar46);
        auVar47 = vsubps_avx(auVar47,auVar49);
        auVar64 = vminps_avx(auVar57,auVar48);
        auVar57 = vmaxps_avx(auVar57,auVar48);
        auVar65 = vminps_avx(auVar45,auVar47);
        auVar65 = vminps_avx(auVar64,auVar65);
        auVar64 = vmaxps_avx(auVar45,auVar47);
        auVar57 = vmaxps_avx(auVar57,auVar64);
        fVar216 = auVar50._0_4_;
        auVar206._0_4_ = fVar216 * auVar65._0_4_;
        auVar206._4_4_ = fVar216 * auVar65._4_4_;
        auVar206._8_4_ = fVar216 * auVar65._8_4_;
        auVar206._12_4_ = fVar216 * auVar65._12_4_;
        auVar219._0_4_ = fVar216 * auVar57._0_4_;
        auVar219._4_4_ = fVar216 * auVar57._4_4_;
        auVar219._8_4_ = fVar216 * auVar57._8_4_;
        auVar219._12_4_ = fVar216 * auVar57._12_4_;
        auVar257 = ZEXT1664(local_328);
        auVar54 = vinsertps_avx512f(local_328,auVar55,0x10);
        auVar48 = vinsertps_avx(auVar63,auVar58,0x10);
        auVar109._0_4_ = auVar54._0_4_ + auVar48._0_4_;
        auVar109._4_4_ = auVar54._4_4_ + auVar48._4_4_;
        auVar109._8_4_ = auVar54._8_4_ + auVar48._8_4_;
        auVar109._12_4_ = auVar54._12_4_ + auVar48._12_4_;
        auVar17._8_4_ = 0x3f000000;
        auVar17._0_8_ = 0x3f0000003f000000;
        auVar17._12_4_ = 0x3f000000;
        auVar52 = vmulps_avx512vl(auVar109,auVar17);
        auVar65 = vshufps_avx(auVar52,auVar52,0x54);
        uVar108 = auVar52._0_4_;
        auVar120._4_4_ = uVar108;
        auVar120._0_4_ = uVar108;
        auVar120._8_4_ = uVar108;
        auVar120._12_4_ = uVar108;
        auVar47 = vfmadd213ps_avx512vl(local_e8,auVar120,auVar255._0_16_);
        auVar45 = vfmadd213ps_avx512vl(local_f8,auVar120,auVar56);
        auVar64 = vfmadd213ps_fma(local_108,auVar120,local_308);
        auVar57 = vsubps_avx(auVar45,auVar47);
        auVar47 = vfmadd213ps_fma(auVar57,auVar120,auVar47);
        auVar57 = vsubps_avx(auVar64,auVar45);
        auVar57 = vfmadd213ps_fma(auVar57,auVar120,auVar45);
        auVar57 = vsubps_avx(auVar57,auVar47);
        auVar64 = vfmadd231ps_fma(auVar47,auVar57,auVar120);
        auVar46 = vmulps_avx512vl(auVar57,auVar42);
        auVar227._8_8_ = auVar64._0_8_;
        auVar227._0_8_ = auVar64._0_8_;
        auVar57 = vshufpd_avx(auVar64,auVar64,3);
        auVar64 = vshufps_avx(auVar52,auVar52,0x55);
        auVar47 = vsubps_avx(auVar57,auVar227);
        auVar45 = vfmadd231ps_fma(auVar227,auVar64,auVar47);
        auVar240._8_8_ = auVar46._0_8_;
        auVar240._0_8_ = auVar46._0_8_;
        auVar57 = vshufpd_avx(auVar46,auVar46,3);
        auVar57 = vsubps_avx(auVar57,auVar240);
        auVar64 = vfmadd213ps_fma(auVar57,auVar64,auVar240);
        auVar121._0_8_ = auVar47._0_8_ ^ 0x8000000080000000;
        auVar121._8_4_ = auVar47._8_4_ ^ 0x80000000;
        auVar121._12_4_ = auVar47._12_4_ ^ 0x80000000;
        auVar57 = vmovshdup_avx(auVar64);
        auVar241._0_8_ = auVar57._0_8_ ^ 0x8000000080000000;
        auVar241._8_4_ = auVar57._8_4_ ^ 0x80000000;
        auVar241._12_4_ = auVar57._12_4_ ^ 0x80000000;
        auVar46 = vmovshdup_avx512vl(auVar47);
        auVar49 = vpermt2ps_avx512vl(auVar241,ZEXT416(5),auVar47);
        auVar57 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar57._0_4_ * auVar47._0_4_)),auVar64,auVar46
                                     );
        auVar64 = vpermt2ps_avx512vl(auVar64,SUB6416(ZEXT464(4),0),auVar121);
        auVar132._0_4_ = auVar57._0_4_;
        auVar132._4_4_ = auVar132._0_4_;
        auVar132._8_4_ = auVar132._0_4_;
        auVar132._12_4_ = auVar132._0_4_;
        auVar57 = vdivps_avx(auVar49,auVar132);
        auVar64 = vdivps_avx(auVar64,auVar132);
        fVar199 = auVar45._0_4_;
        auVar47 = vshufps_avx(auVar45,auVar45,0x55);
        fVar216 = auVar64._0_4_;
        auVar228._0_4_ = fVar199 * auVar57._0_4_ + auVar47._0_4_ * fVar216;
        auVar228._4_4_ = fVar199 * auVar57._4_4_ + auVar47._4_4_ * auVar64._4_4_;
        auVar228._8_4_ = fVar199 * auVar57._8_4_ + auVar47._8_4_ * auVar64._8_4_;
        auVar228._12_4_ = fVar199 * auVar57._12_4_ + auVar47._12_4_ * auVar64._12_4_;
        auVar53 = vsubps_avx(auVar65,auVar228);
        auVar45 = vmovshdup_avx(auVar57);
        auVar65 = vinsertps_avx(auVar183,auVar206,0x1c);
        auVar242._0_4_ = auVar45._0_4_ * auVar65._0_4_;
        auVar242._4_4_ = auVar45._4_4_ * auVar65._4_4_;
        auVar242._8_4_ = auVar45._8_4_ * auVar65._8_4_;
        auVar242._12_4_ = auVar45._12_4_ * auVar65._12_4_;
        auVar47 = vinsertps_avx(auVar169,auVar219,0x1c);
        auVar229._0_4_ = auVar45._0_4_ * auVar47._0_4_;
        auVar229._4_4_ = auVar45._4_4_ * auVar47._4_4_;
        auVar229._8_4_ = auVar45._8_4_ * auVar47._8_4_;
        auVar229._12_4_ = auVar45._12_4_ * auVar47._12_4_;
        auVar51 = vminps_avx512vl(auVar242,auVar229);
        auVar49 = vmaxps_avx(auVar229,auVar242);
        auVar50 = vmovshdup_avx(auVar64);
        auVar45 = vinsertps_avx(auVar206,auVar183,0x4c);
        auVar207._0_4_ = auVar50._0_4_ * auVar45._0_4_;
        auVar207._4_4_ = auVar50._4_4_ * auVar45._4_4_;
        auVar207._8_4_ = auVar50._8_4_ * auVar45._8_4_;
        auVar207._12_4_ = auVar50._12_4_ * auVar45._12_4_;
        auVar46 = vinsertps_avx(auVar219,auVar169,0x4c);
        auVar220._0_4_ = auVar50._0_4_ * auVar46._0_4_;
        auVar220._4_4_ = auVar50._4_4_ * auVar46._4_4_;
        auVar220._8_4_ = auVar50._8_4_ * auVar46._8_4_;
        auVar220._12_4_ = auVar50._12_4_ * auVar46._12_4_;
        auVar50 = vminps_avx(auVar207,auVar220);
        auVar51 = vaddps_avx512vl(auVar51,auVar50);
        auVar50 = vmaxps_avx(auVar220,auVar207);
        auVar208._0_4_ = auVar49._0_4_ + auVar50._0_4_;
        auVar208._4_4_ = auVar49._4_4_ + auVar50._4_4_;
        auVar208._8_4_ = auVar49._8_4_ + auVar50._8_4_;
        auVar208._12_4_ = auVar49._12_4_ + auVar50._12_4_;
        auVar221._8_8_ = 0x3f80000000000000;
        auVar221._0_8_ = 0x3f80000000000000;
        auVar49 = vsubps_avx(auVar221,auVar208);
        auVar50 = vsubps_avx(auVar221,auVar51);
        auVar51 = vsubps_avx(auVar54,auVar52);
        auVar52 = vsubps_avx(auVar48,auVar52);
        fVar214 = auVar51._0_4_;
        auVar243._0_4_ = fVar214 * auVar49._0_4_;
        fVar215 = auVar51._4_4_;
        auVar243._4_4_ = fVar215 * auVar49._4_4_;
        fVar110 = auVar51._8_4_;
        auVar243._8_4_ = fVar110 * auVar49._8_4_;
        fVar119 = auVar51._12_4_;
        auVar243._12_4_ = fVar119 * auVar49._12_4_;
        auVar59 = vbroadcastss_avx512vl(auVar57);
        auVar65 = vmulps_avx512vl(auVar59,auVar65);
        auVar47 = vmulps_avx512vl(auVar59,auVar47);
        auVar59 = vminps_avx512vl(auVar65,auVar47);
        auVar65 = vmaxps_avx(auVar47,auVar65);
        auVar184._0_4_ = fVar216 * auVar45._0_4_;
        auVar184._4_4_ = fVar216 * auVar45._4_4_;
        auVar184._8_4_ = fVar216 * auVar45._8_4_;
        auVar184._12_4_ = fVar216 * auVar45._12_4_;
        auVar170._0_4_ = fVar216 * auVar46._0_4_;
        auVar170._4_4_ = fVar216 * auVar46._4_4_;
        auVar170._8_4_ = fVar216 * auVar46._8_4_;
        auVar170._12_4_ = fVar216 * auVar46._12_4_;
        auVar47 = vminps_avx(auVar184,auVar170);
        auVar45 = vaddps_avx512vl(auVar59,auVar47);
        auVar46 = vmulps_avx512vl(auVar51,auVar50);
        fVar199 = auVar52._0_4_;
        auVar209._0_4_ = fVar199 * auVar49._0_4_;
        fVar211 = auVar52._4_4_;
        auVar209._4_4_ = fVar211 * auVar49._4_4_;
        fVar212 = auVar52._8_4_;
        auVar209._8_4_ = fVar212 * auVar49._8_4_;
        fVar213 = auVar52._12_4_;
        auVar209._12_4_ = fVar213 * auVar49._12_4_;
        auVar222._0_4_ = fVar199 * auVar50._0_4_;
        auVar222._4_4_ = fVar211 * auVar50._4_4_;
        auVar222._8_4_ = fVar212 * auVar50._8_4_;
        auVar222._12_4_ = fVar213 * auVar50._12_4_;
        auVar47 = vmaxps_avx(auVar170,auVar184);
        auVar171._0_4_ = auVar65._0_4_ + auVar47._0_4_;
        auVar171._4_4_ = auVar65._4_4_ + auVar47._4_4_;
        auVar171._8_4_ = auVar65._8_4_ + auVar47._8_4_;
        auVar171._12_4_ = auVar65._12_4_ + auVar47._12_4_;
        auVar185._8_8_ = 0x3f800000;
        auVar185._0_8_ = 0x3f800000;
        auVar65 = vsubps_avx(auVar185,auVar171);
        auVar47 = vsubps_avx(auVar185,auVar45);
        auVar235._0_4_ = fVar214 * auVar65._0_4_;
        auVar235._4_4_ = fVar215 * auVar65._4_4_;
        auVar235._8_4_ = fVar110 * auVar65._8_4_;
        auVar235._12_4_ = fVar119 * auVar65._12_4_;
        auVar230._0_4_ = fVar214 * auVar47._0_4_;
        auVar230._4_4_ = fVar215 * auVar47._4_4_;
        auVar230._8_4_ = fVar110 * auVar47._8_4_;
        auVar230._12_4_ = fVar119 * auVar47._12_4_;
        auVar172._0_4_ = fVar199 * auVar65._0_4_;
        auVar172._4_4_ = fVar211 * auVar65._4_4_;
        auVar172._8_4_ = fVar212 * auVar65._8_4_;
        auVar172._12_4_ = fVar213 * auVar65._12_4_;
        auVar186._0_4_ = fVar199 * auVar47._0_4_;
        auVar186._4_4_ = fVar211 * auVar47._4_4_;
        auVar186._8_4_ = fVar212 * auVar47._8_4_;
        auVar186._12_4_ = fVar213 * auVar47._12_4_;
        auVar65 = vminps_avx(auVar235,auVar230);
        auVar47 = vminps_avx(auVar172,auVar186);
        auVar45 = vminps_avx(auVar65,auVar47);
        auVar65 = vmaxps_avx(auVar230,auVar235);
        auVar47 = vmaxps_avx(auVar186,auVar172);
        auVar47 = vmaxps_avx(auVar47,auVar65);
        auVar49 = vminps_avx512vl(auVar243,auVar46);
        auVar65 = vminps_avx(auVar209,auVar222);
        auVar65 = vminps_avx(auVar49,auVar65);
        auVar65 = vhaddps_avx(auVar45,auVar65);
        auVar46 = vmaxps_avx512vl(auVar46,auVar243);
        auVar45 = vmaxps_avx(auVar222,auVar209);
        auVar45 = vmaxps_avx(auVar45,auVar46);
        auVar47 = vhaddps_avx(auVar47,auVar45);
        auVar65 = vshufps_avx(auVar65,auVar65,0xe8);
        auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
        auVar173._0_4_ = auVar65._0_4_ + auVar53._0_4_;
        auVar173._4_4_ = auVar65._4_4_ + auVar53._4_4_;
        auVar173._8_4_ = auVar65._8_4_ + auVar53._8_4_;
        auVar173._12_4_ = auVar65._12_4_ + auVar53._12_4_;
        auVar187._0_4_ = auVar47._0_4_ + auVar53._0_4_;
        auVar187._4_4_ = auVar47._4_4_ + auVar53._4_4_;
        auVar187._8_4_ = auVar47._8_4_ + auVar53._8_4_;
        auVar187._12_4_ = auVar47._12_4_ + auVar53._12_4_;
        auVar65 = vmaxps_avx(auVar54,auVar173);
        auVar47 = vminps_avx(auVar187,auVar48);
        uVar35 = vcmpps_avx512vl(auVar47,auVar65,1);
        local_318 = vinsertps_avx(auVar55,auVar58,0x10);
        auVar250 = ZEXT1664(local_318);
        if ((uVar35 & 3) == 0) {
          vucomiss_avx512f(local_328);
          auVar255 = ZEXT1664(local_338);
          if (uVar37 < 4 && (uVar5 == 0 || lVar36 == 0)) {
            bVar15 = false;
          }
          else {
            lVar36 = 200;
            do {
              auVar65 = vsubss_avx512f(auVar44,auVar53);
              fVar212 = auVar65._0_4_;
              fVar199 = fVar212 * fVar212 * fVar212;
              fVar213 = auVar53._0_4_;
              fVar211 = fVar213 * 3.0 * fVar212 * fVar212;
              fVar212 = fVar212 * fVar213 * fVar213 * 3.0;
              auVar155._4_4_ = fVar199;
              auVar155._0_4_ = fVar199;
              auVar155._8_4_ = fVar199;
              auVar155._12_4_ = fVar199;
              auVar139._4_4_ = fVar211;
              auVar139._0_4_ = fVar211;
              auVar139._8_4_ = fVar211;
              auVar139._12_4_ = fVar211;
              auVar114._4_4_ = fVar212;
              auVar114._0_4_ = fVar212;
              auVar114._8_4_ = fVar212;
              auVar114._12_4_ = fVar212;
              fVar213 = fVar213 * fVar213 * fVar213;
              auVar162._0_4_ = (float)local_218._0_4_ * fVar213;
              auVar162._4_4_ = (float)local_218._4_4_ * fVar213;
              auVar162._8_4_ = fStack_210 * fVar213;
              auVar162._12_4_ = fStack_20c * fVar213;
              auVar65 = vfmadd231ps_fma(auVar162,local_308,auVar114);
              auVar65 = vfmadd231ps_avx512vl(auVar65,auVar56,auVar139);
              auVar65 = vfmadd231ps_avx512vl(auVar65,local_338,auVar155);
              auVar115._8_8_ = auVar65._0_8_;
              auVar115._0_8_ = auVar65._0_8_;
              auVar65 = vshufpd_avx(auVar65,auVar65,3);
              auVar47 = vshufps_avx(auVar53,auVar53,0x55);
              auVar65 = vsubps_avx(auVar65,auVar115);
              auVar47 = vfmadd213ps_fma(auVar65,auVar47,auVar115);
              fVar199 = auVar47._0_4_;
              auVar65 = vshufps_avx(auVar47,auVar47,0x55);
              auVar116._0_4_ = auVar57._0_4_ * fVar199 + fVar216 * auVar65._0_4_;
              auVar116._4_4_ = auVar57._4_4_ * fVar199 + auVar64._4_4_ * auVar65._4_4_;
              auVar116._8_4_ = auVar57._8_4_ * fVar199 + auVar64._8_4_ * auVar65._8_4_;
              auVar116._12_4_ = auVar57._12_4_ * fVar199 + auVar64._12_4_ * auVar65._12_4_;
              auVar53 = vsubps_avx(auVar53,auVar116);
              auVar65 = vandps_avx512vl(auVar47,auVar256._0_16_);
              auVar47 = vprolq_avx512vl(auVar65,0x20);
              auVar65 = vmaxss_avx(auVar47,auVar65);
              bVar13 = auVar65._0_4_ <= (float)local_228._0_4_;
              if (auVar65._0_4_ < (float)local_228._0_4_) {
                auVar57 = vucomiss_avx512f(auVar62);
                if (bVar13) {
                  auVar64 = vucomiss_avx512f(auVar57);
                  auVar254 = ZEXT1664(auVar64);
                  if (bVar13) {
                    vmovshdup_avx(auVar57);
                    auVar64 = vucomiss_avx512f(auVar62);
                    if (bVar13) {
                      auVar65 = vucomiss_avx512f(auVar64);
                      auVar254 = ZEXT1664(auVar65);
                      if (bVar13) {
                        auVar44 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                0x1c);
                        auVar51 = vinsertps_avx(auVar44,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                      m128[2]),0x28);
                        aVar1 = (ray->org).field_0;
                        auVar44 = vsubps_avx(local_238,(undefined1  [16])aVar1);
                        auVar44 = vdpps_avx(auVar44,auVar51,0x7f);
                        auVar47 = vsubps_avx(local_248,(undefined1  [16])aVar1);
                        auVar47 = vdpps_avx(auVar47,auVar51,0x7f);
                        auVar48 = vsubps_avx(local_258,(undefined1  [16])aVar1);
                        auVar48 = vdpps_avx(auVar48,auVar51,0x7f);
                        auVar45 = vsubps_avx(local_268,(undefined1  [16])aVar1);
                        auVar45 = vdpps_avx(auVar45,auVar51,0x7f);
                        auVar46 = vsubps_avx(_local_278,(undefined1  [16])aVar1);
                        auVar46 = vdpps_avx(auVar46,auVar51,0x7f);
                        auVar49 = vsubps_avx(_local_288,(undefined1  [16])aVar1);
                        auVar49 = vdpps_avx(auVar49,auVar51,0x7f);
                        auVar50 = vsubps_avx(_local_298,(undefined1  [16])aVar1);
                        auVar50 = vdpps_avx(auVar50,auVar51,0x7f);
                        auVar52 = vsubps_avx(_local_2a8,(undefined1  [16])aVar1);
                        auVar51 = vdpps_avx(auVar52,auVar51,0x7f);
                        auVar52 = vsubss_avx512f(auVar65,auVar64);
                        fVar216 = auVar64._0_4_;
                        auVar64 = vfmadd231ss_fma(ZEXT416((uint)(auVar46._0_4_ * fVar216)),auVar52,
                                                  auVar44);
                        auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar49._0_4_ * fVar216)),auVar52,
                                                  auVar47);
                        auVar47 = vfmadd231ss_fma(ZEXT416((uint)(auVar50._0_4_ * fVar216)),auVar52,
                                                  auVar48);
                        auVar48 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar51._0_4_)),auVar52,
                                                  auVar45);
                        auVar65 = vsubss_avx512f(auVar65,auVar57);
                        auVar163._0_4_ = auVar65._0_4_;
                        fVar216 = auVar163._0_4_ * auVar163._0_4_ * auVar163._0_4_;
                        fVar212 = auVar57._0_4_;
                        fVar199 = fVar212 * 3.0 * auVar163._0_4_ * auVar163._0_4_;
                        fVar211 = auVar163._0_4_ * fVar212 * fVar212 * 3.0;
                        fVar214 = fVar212 * fVar212 * fVar212;
                        auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar48._0_4_)),
                                                  ZEXT416((uint)fVar211),auVar47);
                        auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar199),auVar44);
                        auVar64 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar216),auVar64);
                        fVar213 = auVar64._0_4_;
                        if (((ray->org).field_0.m128[3] <= fVar213) &&
                           (fVar215 = ray->tfar, fVar213 <= fVar215)) {
                          auVar64 = vshufps_avx(auVar57,auVar57,0x55);
                          auVar44 = vsubps_avx512vl(auVar43,auVar64);
                          fVar110 = auVar64._0_4_;
                          auVar195._0_4_ = fVar110 * (float)local_278._0_4_;
                          fVar119 = auVar64._4_4_;
                          auVar195._4_4_ = fVar119 * (float)local_278._4_4_;
                          fVar127 = auVar64._8_4_;
                          auVar195._8_4_ = fVar127 * fStack_270;
                          fVar143 = auVar64._12_4_;
                          auVar195._12_4_ = fVar143 * fStack_26c;
                          auVar210._0_4_ = fVar110 * (float)local_288._0_4_;
                          auVar210._4_4_ = fVar119 * (float)local_288._4_4_;
                          auVar210._8_4_ = fVar127 * fStack_280;
                          auVar210._12_4_ = fVar143 * fStack_27c;
                          auVar223._0_4_ = fVar110 * (float)local_298._0_4_;
                          auVar223._4_4_ = fVar119 * (float)local_298._4_4_;
                          auVar223._8_4_ = fVar127 * fStack_290;
                          auVar223._12_4_ = fVar143 * fStack_28c;
                          auVar174._0_4_ = fVar110 * (float)local_2a8._0_4_;
                          auVar174._4_4_ = fVar119 * (float)local_2a8._4_4_;
                          auVar174._8_4_ = fVar127 * fStack_2a0;
                          auVar174._12_4_ = fVar143 * fStack_29c;
                          auVar43 = vfmadd231ps_fma(auVar195,auVar44,local_238);
                          auVar64 = vfmadd231ps_fma(auVar210,auVar44,local_248);
                          auVar65 = vfmadd231ps_fma(auVar223,auVar44,local_258);
                          auVar44 = vfmadd231ps_fma(auVar174,auVar44,local_268);
                          auVar43 = vsubps_avx(auVar64,auVar43);
                          auVar64 = vsubps_avx(auVar65,auVar64);
                          auVar65 = vsubps_avx(auVar44,auVar65);
                          auVar224._0_4_ = fVar212 * auVar64._0_4_;
                          auVar224._4_4_ = fVar212 * auVar64._4_4_;
                          auVar224._8_4_ = fVar212 * auVar64._8_4_;
                          auVar224._12_4_ = fVar212 * auVar64._12_4_;
                          auVar163._4_4_ = auVar163._0_4_;
                          auVar163._8_4_ = auVar163._0_4_;
                          auVar163._12_4_ = auVar163._0_4_;
                          auVar43 = vfmadd231ps_fma(auVar224,auVar163,auVar43);
                          auVar175._0_4_ = fVar212 * auVar65._0_4_;
                          auVar175._4_4_ = fVar212 * auVar65._4_4_;
                          auVar175._8_4_ = fVar212 * auVar65._8_4_;
                          auVar175._12_4_ = fVar212 * auVar65._12_4_;
                          auVar64 = vfmadd231ps_fma(auVar175,auVar163,auVar64);
                          auVar176._0_4_ = fVar212 * auVar64._0_4_;
                          auVar176._4_4_ = fVar212 * auVar64._4_4_;
                          auVar176._8_4_ = fVar212 * auVar64._8_4_;
                          auVar176._12_4_ = fVar212 * auVar64._12_4_;
                          auVar43 = vfmadd231ps_fma(auVar176,auVar163,auVar43);
                          auVar42 = vmulps_avx512vl(auVar43,auVar42);
                          pGVar6 = (context->scene->geometries).items[uVar40].ptr;
                          if ((pGVar6->mask & ray->mask) == 0) {
                            bVar13 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar13 = true,
                                  pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar156._0_4_ = fVar214 * (float)local_148._0_4_;
                            auVar156._4_4_ = fVar214 * (float)local_148._4_4_;
                            auVar156._8_4_ = fVar214 * fStack_140;
                            auVar156._12_4_ = fVar214 * fStack_13c;
                            auVar140._4_4_ = fVar211;
                            auVar140._0_4_ = fVar211;
                            auVar140._8_4_ = fVar211;
                            auVar140._12_4_ = fVar211;
                            auVar43 = vfmadd132ps_fma(auVar140,auVar156,local_138);
                            auVar133._4_4_ = fVar199;
                            auVar133._0_4_ = fVar199;
                            auVar133._8_4_ = fVar199;
                            auVar133._12_4_ = fVar199;
                            auVar43 = vfmadd132ps_fma(auVar133,auVar43,local_128);
                            auVar122._4_4_ = fVar216;
                            auVar122._0_4_ = fVar216;
                            auVar122._8_4_ = fVar216;
                            auVar122._12_4_ = fVar216;
                            auVar65 = vfmadd132ps_fma(auVar122,auVar43,local_118);
                            auVar43 = vshufps_avx(auVar65,auVar65,0xc9);
                            auVar64 = vshufps_avx(auVar42,auVar42,0xc9);
                            auVar123._0_4_ = auVar65._0_4_ * auVar64._0_4_;
                            auVar123._4_4_ = auVar65._4_4_ * auVar64._4_4_;
                            auVar123._8_4_ = auVar65._8_4_ * auVar64._8_4_;
                            auVar123._12_4_ = auVar65._12_4_ * auVar64._12_4_;
                            auVar43 = vfmsub231ps_fma(auVar123,auVar42,auVar43);
                            auVar42 = vshufps_avx(auVar43,auVar43,0xe9);
                            local_178 = vmovlps_avx(auVar42);
                            local_170 = auVar43._0_4_;
                            local_16c = vmovlps_avx(auVar57);
                            local_164 = (int)local_2e8;
                            local_160 = uVar40;
                            local_15c = context->user->instID[0];
                            local_158 = context->user->instPrimID[0];
                            ray->tfar = fVar213;
                            local_33c = -1;
                            local_2d8.valid = &local_33c;
                            local_2d8.geometryUserPtr = pGVar6->userPtr;
                            local_2d8.context = context->user;
                            local_2d8.hit = (RTCHitN *)&local_178;
                            local_2d8.N = 1;
                            local_2d8.ray = (RTCRayN *)ray;
                            if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01ef5863:
                              auVar42 = auVar259._0_16_;
                              p_Var9 = context->args->filter;
                              if (p_Var9 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var9)(&local_2d8);
                                  auVar250 = ZEXT1664(local_318);
                                  auVar255 = ZEXT1664(local_338);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar253 = ZEXT1664(auVar43);
                                  auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar252 = ZEXT3264(auVar70);
                                  auVar96._16_16_ = auVar70._16_16_;
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar256 = ZEXT1664(auVar43);
                                  auVar254 = ZEXT464(0x3f800000);
                                  auVar43 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar251 = ZEXT1664(auVar43);
                                  auVar42 = vxorps_avx512vl(auVar42,auVar42);
                                  auVar259 = ZEXT1664(auVar42);
                                }
                                if (*local_2d8.valid == 0) goto LAB_01ef59a8;
                              }
                              bVar13 = true;
                            }
                            else {
                              local_2f0 = lVar38;
                              (*pGVar6->occlusionFilterN)(&local_2d8);
                              auVar250 = ZEXT1664(local_318);
                              auVar255 = ZEXT1664(local_338);
                              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                              auVar253 = ZEXT1664(auVar42);
                              auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar252 = ZEXT3264(auVar70);
                              auVar96._16_16_ = auVar70._16_16_;
                              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar256 = ZEXT1664(auVar42);
                              auVar254 = ZEXT464(0x3f800000);
                              auVar42 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar251 = ZEXT1664(auVar42);
                              auVar42 = vxorps_avx512vl(auVar62,auVar62);
                              auVar259 = ZEXT1664(auVar42);
                              lVar38 = local_2f0;
                              if (*local_2d8.valid != 0) goto LAB_01ef5863;
LAB_01ef59a8:
                              bVar13 = false;
                            }
                            if (!bVar13) {
                              ray->tfar = fVar215;
                            }
                          }
                          bVar41 = (bool)(bVar41 | bVar13);
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar36 = lVar36 + -1;
            } while (lVar36 != 0);
          }
        }
        else {
          auVar255 = ZEXT1664(local_338);
        }
      }
    } while (bVar15);
    auVar42 = vinsertps_avx(local_328,auVar63,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_hn(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());
          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }